

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  ImBitVector *this_00;
  uint *puVar1;
  undefined4 uVar2;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar5;
  byte bVar6;
  byte bVar7;
  ImWchar IVar8;
  uint uVar9;
  ImFontAtlas *pIVar10;
  ImFont *pIVar11;
  ImFont *pIVar12;
  ImFontConfig *pIVar13;
  undefined8 *puVar14;
  ImFontConfig *pIVar15;
  long lVar16;
  char cVar17;
  char cVar22;
  short sVar30;
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [16];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  stbtt__buf fontdict;
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [15];
  undefined1 auVar45 [13];
  undefined1 auVar46 [14];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [15];
  unkbyte10 Var51;
  uint6 uVar52;
  undefined1 auVar53 [14];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  stbtt__active_edge **ppsVar56;
  bool bVar57;
  ushort uVar58;
  ushort uVar59;
  short sVar60;
  stbtt_uint32 sVar61;
  int iVar67;
  int iVar68;
  uint uVar69;
  stbtt__active_edge *z;
  ulong uVar70;
  stbtt_uint32 sVar62;
  stbtt_uint32 sVar63;
  stbtt_uint32 sVar64;
  stbtt_uint32 sVar65;
  void *pvVar71;
  ulong uVar72;
  uint uVar66;
  ImWchar *pIVar73;
  long lVar74;
  void *pvVar75;
  long lVar76;
  void *pvVar77;
  stbrp_context *ptr;
  uchar *puVar78;
  stbtt__buf *scanline;
  stbtt__buf *psVar79;
  undefined8 *puVar80;
  stbtt__active_edge *psVar81;
  bool bVar82;
  long lVar83;
  ushort uVar84;
  int iVar85;
  long lVar86;
  uint uVar87;
  uint uVar88;
  int *piVar89;
  ushort *puVar90;
  size_t sVar91;
  stbtt__edge *psVar92;
  ulong uVar93;
  bool bVar94;
  int iVar95;
  long lVar96;
  stbtt_fontinfo *psVar97;
  uchar uVar98;
  byte *pbVar99;
  uint *ptr_00;
  stbrp_node **ppsVar100;
  stbtt__edge *psVar101;
  ulong uVar102;
  int iVar103;
  ulong uVar104;
  uint uVar105;
  void *p;
  undefined1 auVar106 [8];
  stbtt__active_edge *psVar107;
  ImU32 bit_n;
  uint uVar108;
  size_t sVar109;
  int iVar110;
  void *pvVar111;
  byte *pbVar112;
  byte bVar113;
  short sVar114;
  char cVar122;
  float fVar115;
  float fVar116;
  float fVar117;
  short sVar124;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  undefined1 auVar118 [16];
  char cVar121;
  char cVar125;
  ushort uVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar141;
  undefined1 in_XMM3 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar156;
  undefined1 auVar152 [16];
  float fVar157;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  undefined4 uVar159;
  uint uVar167;
  uint uVar169;
  undefined1 auVar164 [16];
  float fVar168;
  float fVar170;
  uint uVar171;
  float fVar172;
  undefined1 auVar165 [16];
  float fVar173;
  uint uVar178;
  uint uVar180;
  undefined1 auVar174 [16];
  float fVar179;
  float fVar181;
  uint uVar182;
  float fVar183;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined4 uVar184;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  stbtt__buf sVar199;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  float x0_2;
  ImVector<stbrp_rect> buf_rects;
  stbtt_uint32 fdarrayoff;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined8 in_stack_fffffffffffffb00;
  undefined1 local_4e8 [8];
  ulong uStack_4e0;
  void *pvVar200;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined8 local_488;
  float fStack_480;
  float fStack_47c;
  int local_478;
  float local_474;
  undefined1 local_470 [8];
  undefined1 local_468 [16];
  stbrp_node *local_458;
  stbtt__edge *local_450;
  stbtt__point *local_448;
  int local_43c;
  undefined1 local_438 [16];
  ulong local_420;
  undefined1 local_418 [8];
  void *pvStack_410;
  void *local_408;
  undefined8 local_400;
  float local_3f8;
  uint local_3f4;
  stbtt_fontinfo *local_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  ulong local_3c0;
  long local_3b8;
  stbtt__active_edge *local_3b0;
  float local_3a4;
  undefined8 *local_3a0;
  long local_398;
  void *pvStack_390;
  uchar *local_388;
  ulong local_380;
  ulong local_378;
  long local_370;
  ulong local_368;
  int local_35c;
  uint local_358;
  uint local_354;
  float local_350;
  int local_34c;
  int local_348;
  int local_344;
  stbrp_context *local_340;
  float *local_338;
  float *local_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [16];
  size_t local_308;
  ImFontConfig *local_300;
  long local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  uchar *local_2e0;
  long local_2d8;
  short *local_2d0;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined6 uVar160;
  undefined8 uVar161;
  undefined1 auVar162 [12];
  undefined1 auVar163 [14];
  undefined1 auVar166 [16];
  undefined6 uVar185;
  undefined8 uVar186;
  undefined1 auVar187 [12];
  undefined1 auVar188 [14];
  undefined1 auVar192 [16];
  
  local_3d8._8_8_ = local_3d8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x829,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  pvVar200 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar9 = (atlas->ConfigData).Size;
  lVar83 = (long)(int)uVar9;
  if (0 < lVar83) {
    uVar70 = 8;
    if (8 < uVar9) {
      uVar70 = (ulong)uVar9;
    }
    pvVar200 = ImGui::MemAlloc(uVar70 * 0x110);
  }
  uVar69 = (atlas->Fonts).Size;
  if ((long)(int)uVar69 < 1) {
    pvVar71 = (void *)0x0;
  }
  else {
    uVar70 = 8;
    if (8 < uVar69) {
      uVar70 = (ulong)uVar69;
    }
    pvVar71 = ImGui::MemAlloc(uVar70 << 5);
  }
  local_308 = lVar83 * 0x110;
  memset(pvVar200,0,local_308);
  sVar109 = (long)(int)uVar69 << 5;
  uStack_4e0 = (ulong)local_4e8;
  local_4e8 = (undefined1  [8])pvVar71;
  memset(pvVar71,0,sVar109);
  uVar66 = (atlas->ConfigData).Size;
  uVar70 = (ulong)uVar66;
  iVar95 = (int)uVar69 >> 0x1f;
  local_3d8._0_8_ = sVar109;
  uVar108 = uVar69;
  if (0 < (int)uVar66) {
    lVar96 = 0;
    do {
      iVar85 = (int)uVar70;
      uVar69 = uVar108;
      if (lVar83 <= lVar96) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        iVar85 = (atlas->ConfigData).Size;
        uVar69 = uVar108;
      }
      if (iVar85 <= lVar96) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      local_498._0_8_ = (atlas->ConfigData).Data;
      if ((((ImFontConfig *)(local_498._0_8_ + lVar96 * 0x88))->DstFont == (ImFont *)0x0) ||
         (pIVar10 = ((ImFontConfig *)(local_498._0_8_ + lVar96 * 0x88))->DstFont->ContainerAtlas,
         pIVar10 != atlas && pIVar10 != (ImFontAtlas *)0x0)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x841,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      }
      pvVar111 = (void *)(lVar96 * 0x110 + (long)pvVar200);
      local_498._0_8_ = local_498._0_8_ + lVar96 * 0x88;
      *(undefined4 *)((long)pvVar111 + 0xe0) = 0xffffffff;
      uVar70 = (ulong)(atlas->Fonts).Size;
      if (0 < (long)uVar70) {
        pIVar11 = ((ImFontConfig *)local_498._0_8_)->DstFont;
        uVar72 = 0;
        do {
          pIVar12 = (atlas->Fonts).Data[uVar72];
          if (pIVar11 == pIVar12) {
            *(int *)((long)pvVar111 + 0xe0) = (int)uVar72;
            goto LAB_001ca141;
          }
          uVar72 = uVar72 + 1;
        } while ((uVar72 < uVar70) && (pIVar11 != pIVar12));
      }
      local_488 = pvVar111;
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                  ,0x848,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
      uVar72 = (ulong)*(uint *)((long)pvVar111 + 0xe0);
      pvVar111 = local_488;
LAB_001ca141:
      local_468._0_8_ = lVar96;
      local_488 = pvVar111;
      if ((int)uVar72 == -1) {
LAB_001cabea:
        if (pvVar71 != (void *)0x0) {
          ImGui::MemFree(pvVar71);
        }
        bVar57 = false;
        goto LAB_001cd8ac;
      }
      pbVar112 = *(byte **)local_498._0_8_;
      iVar85 = *(int *)(local_498._0_8_ + 0x10);
      bVar113 = *pbVar112;
      uVar66 = 0xffffffff;
      if (bVar113 < 0x4f) {
        if (bVar113 == 0) {
          if (pbVar112[1] == 1) goto LAB_001ca1ce;
          goto LAB_001ca23b;
        }
        if ((bVar113 != 0x31) || (pbVar112[1] != 0)) goto LAB_001ca23b;
LAB_001ca1ce:
        if ((pbVar112[2] != 0) || (pbVar112[3] != 0)) goto LAB_001ca23b;
LAB_001ca22e:
        uVar66 = -(uint)(iVar85 != 0);
LAB_001ca237:
        if ((int)uVar66 < 0) goto LAB_001ca23b;
      }
      else {
        if (bVar113 == 0x4f) {
          if (((pbVar112[1] == 0x54) && (pbVar112[2] == 0x54)) && (pbVar112[3] == 0x4f))
          goto LAB_001ca22e;
        }
        else if (bVar113 == 0x74) {
          bVar113 = pbVar112[1];
          if (bVar113 == 0x72) {
            if ((pbVar112[2] != 0x75) || (pbVar112[3] != 0x65)) goto LAB_001ca23b;
            goto LAB_001ca22e;
          }
          if (bVar113 == 0x74) {
            if ((pbVar112[2] == 99) && (pbVar112[3] == 0x66)) {
              uVar108 = *(uint *)(pbVar112 + 4);
              uVar108 = uVar108 >> 0x18 | (uVar108 & 0xff0000) >> 8 | (uVar108 & 0xff00) << 8 |
                        uVar108 << 0x18;
              if (((uVar108 == 0x20000) || (uVar108 == 0x10000)) &&
                 (uVar108 = *(uint *)(pbVar112 + 8),
                 iVar85 < (int)(uVar108 >> 0x18 | (uVar108 & 0xff0000) >> 8 |
                                (uVar108 & 0xff00) << 8 | uVar108 << 0x18))) {
                uVar66 = *(uint *)(pbVar112 + (long)iVar85 * 4 + 0xc);
                uVar66 = uVar66 >> 0x18 | (uVar66 & 0xff0000) >> 8 | (uVar66 & 0xff00) << 8 |
                         uVar66 << 0x18;
                goto LAB_001ca237;
              }
            }
          }
          else if (((bVar113 == 0x79) && (pbVar112[2] == 0x70)) && (pbVar112[3] == 0x31))
          goto LAB_001ca22e;
        }
LAB_001ca23b:
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                    ,0x84e,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
        pbVar112 = *(byte **)local_498._0_8_;
      }
      *(byte **)((long)pvVar111 + 8) = pbVar112;
      *(uint *)((long)pvVar111 + 0x10) = uVar66;
      *(undefined8 *)((long)pvVar111 + 0x40) = 0;
      *(undefined8 *)((long)pvVar111 + 0x48) = 0;
      sVar61 = stbtt__find_table(pbVar112,uVar66,"cmap");
      sVar62 = stbtt__find_table(pbVar112,uVar66,"loca");
      local_3e8._0_4_ = sVar62;
      *(stbtt_uint32 *)((long)pvVar111 + 0x18) = sVar62;
      sVar62 = stbtt__find_table(pbVar112,uVar66,"head");
      *(stbtt_uint32 *)((long)pvVar111 + 0x1c) = sVar62;
      sVar63 = stbtt__find_table(pbVar112,uVar66,"glyf");
      local_438._0_4_ = sVar63;
      *(stbtt_uint32 *)((long)pvVar111 + 0x20) = sVar63;
      sVar63 = stbtt__find_table(pbVar112,uVar66,"hhea");
      *(stbtt_uint32 *)((long)pvVar111 + 0x24) = sVar63;
      sVar64 = stbtt__find_table(pbVar112,uVar66,"hmtx");
      *(stbtt_uint32 *)((long)pvVar111 + 0x28) = sVar64;
      sVar65 = stbtt__find_table(pbVar112,uVar66,"kern");
      *(stbtt_uint32 *)((long)pvVar111 + 0x2c) = sVar65;
      sVar65 = stbtt__find_table(pbVar112,uVar66,"GPOS");
      *(stbtt_uint32 *)((long)pvVar111 + 0x30) = sVar65;
      if (((sVar61 == 0) || (sVar62 == 0)) || ((sVar63 == 0 || (sVar64 == 0)))) goto LAB_001cabea;
      if (local_438._0_4_ == 0) {
        local_398 = CONCAT44(local_398._4_4_,2);
        local_470 = (undefined1  [8])((ulong)local_470 & 0xffffffff00000000);
        local_400._0_4_ = 0;
        local_49c = 0;
        sVar62 = stbtt__find_table(pbVar112,uVar66,"CFF ");
        pvVar111 = local_488;
        if (sVar62 != 0) {
          *(undefined8 *)((long)local_488 + 0x90) = 0;
          *(undefined8 *)((long)local_488 + 0x98) = 0;
          *(undefined8 *)((long)local_488 + 0x80) = 0;
          *(undefined8 *)((long)local_488 + 0x88) = 0;
          *(byte **)((long)local_488 + 0x40) = pbVar112 + sVar62;
          *(undefined8 *)((long)local_488 + 0x48) = 0x2000000000000000;
          local_238[0].data = *(uchar **)((long)local_488 + 0x40);
          local_238[0]._8_8_ = *(undefined8 *)((long)local_488 + 0x48);
          iVar85 = local_238[0].cursor;
          iVar67 = local_238[0].size;
          uVar108 = local_238[0].cursor + 2;
          if (local_238[0].cursor < -2 || local_238[0].size < (int)uVar108) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                        ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
          }
          if (iVar67 < (int)uVar108) {
            uVar108 = iVar67;
          }
          if (iVar85 < -2) {
            uVar108 = iVar67;
          }
          uVar105 = 0;
          if ((int)uVar108 < iVar67) {
            uVar105 = (uint)local_238[0].data[(int)uVar108];
          }
          if (iVar67 < (int)uVar105) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                        ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
            uVar105 = iVar67;
          }
          local_238[0].cursor = uVar105;
          stbtt__cff_get_index(local_238);
          sVar199 = stbtt__cff_get_index(local_238);
          _local_418 = stbtt__cff_index_get(sVar199,0);
          stbtt__cff_get_index(local_238);
          sVar199 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)pvVar111 + 0x60) = sVar199;
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x11,1,(stbtt_uint32 *)local_470);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x106,1,(stbtt_uint32 *)&local_398);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x124,1,(stbtt_uint32 *)&local_400);
          stbtt__dict_get_ints((stbtt__buf *)local_418,0x125,1,&local_49c);
          uVar161 = local_238[0]._8_8_;
          sVar199.cursor = uVar69;
          sVar199.data = (uchar *)in_stack_fffffffffffffb00;
          sVar199.size = iVar95;
          fontdict.cursor = in_stack_fffffffffffffb30;
          fontdict.data = (uchar *)pvVar200;
          fontdict.size = in_stack_fffffffffffffb34;
          sVar199 = stbtt__get_subrs(sVar199,fontdict);
          sVar63 = (stbtt_uint32)local_400;
          sVar62 = local_49c;
          *(stbtt__buf *)((long)pvVar111 + 0x70) = sVar199;
          if (((stbtt_uint32)local_398 == 2) && (uVar159 = local_470._0_4_, local_470._0_4_ != 0)) {
            sVar64 = SUB84(uVar161,4);
            if ((stbtt_uint32)local_400 != 0) {
              uVar70 = (ulong)local_49c;
              if (uVar70 == 0) goto LAB_001cabea;
              if (((int)(stbtt_uint32)local_400 < 0) || ((int)sVar64 < (int)(stbtt_uint32)local_400)
                 ) {
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                            ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
              }
              sVar65 = sVar63;
              if ((int)sVar64 < (int)sVar63) {
                sVar65 = sVar64;
              }
              if ((int)sVar63 < 0) {
                sVar65 = sVar64;
              }
              local_238[0].cursor = sVar65;
              sVar199 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar111 + 0x80) = sVar199;
              puVar78 = local_238[0].data + uVar70;
              lVar96 = (ulong)(local_238[0].size - sVar62) << 0x20;
              if ((int)(local_238[0].size - sVar62 | sVar62) < 0 || local_238[0].size < (int)sVar62)
              {
                puVar78 = (uchar *)0x0;
                lVar96 = 0;
              }
              *(uchar **)((long)pvVar111 + 0x90) = puVar78;
              *(long *)((long)pvVar111 + 0x98) = lVar96;
              sVar64 = local_238[0].size;
            }
            if (((int)uVar159 < 0) || ((int)sVar64 < (int)uVar159)) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                          ,0x46c,"stbtt__buf_seek","ImGui ASSERT FAILED: %s");
            }
            sVar62 = uVar159;
            if ((int)sVar64 < (int)uVar159) {
              sVar62 = sVar64;
            }
            if ((int)uVar159 < 0) {
              sVar62 = sVar64;
            }
            local_238[0].cursor = sVar62;
            sVar199 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar111 + 0x50) = sVar199;
            goto LAB_001ca6fa;
          }
        }
        goto LAB_001cabea;
      }
      if (local_3e8._0_4_ == 0) goto LAB_001cabea;
LAB_001ca6fa:
      sVar62 = stbtt__find_table(pbVar112,uVar66,"maxp");
      pvVar111 = local_488;
      if (sVar62 == 0) {
        uVar66 = 0xffff;
      }
      else {
        uVar66 = (uint)(ushort)(*(ushort *)(pbVar112 + (ulong)sVar62 + 4) << 8 |
                               *(ushort *)(pbVar112 + (ulong)sVar62 + 4) >> 8);
      }
      *(uint *)((long)local_488 + 0x14) = uVar66;
      uVar58 = *(ushort *)(pbVar112 + (ulong)sVar61 + 2) << 8 |
               *(ushort *)(pbVar112 + (ulong)sVar61 + 2) >> 8;
      *(undefined4 *)((long)local_488 + 0x34) = 0;
      if (uVar58 == 0) goto LAB_001cabea;
      uVar66 = sVar61 + 4;
      uVar70 = (ulong)uVar58;
      iVar85 = 0;
      do {
        uVar58 = *(ushort *)(pbVar112 + uVar66) << 8 | *(ushort *)(pbVar112 + uVar66) >> 8;
        if ((uVar58 == 0) ||
           ((uVar58 == 3 &&
            ((uVar58 = *(ushort *)(pbVar112 + (ulong)uVar66 + 2) << 8 |
                       *(ushort *)(pbVar112 + (ulong)uVar66 + 2) >> 8, uVar58 == 10 || (uVar58 == 1)
             ))))) {
          uVar108 = *(uint *)(pbVar112 + (ulong)uVar66 + 4);
          iVar85 = (uVar108 >> 0x18 | (uVar108 & 0xff0000) >> 8 | (uVar108 & 0xff00) << 8 |
                   uVar108 << 0x18) + sVar61;
          *(int *)((long)local_488 + 0x34) = iVar85;
        }
        uVar66 = uVar66 + 8;
        uVar70 = uVar70 - 1;
      } while (uVar70 != 0);
      if (iVar85 == 0) goto LAB_001cabea;
      *(uint *)((long)local_488 + 0x38) =
           (uint)(ushort)(*(ushort *)(pbVar112 + (long)*(int *)((long)local_488 + 0x1c) + 0x32) << 8
                         | *(ushort *)(pbVar112 + (long)*(int *)((long)local_488 + 0x1c) + 0x32) >>
                           8);
      iVar85 = *(int *)((long)local_488 + 0xe0);
      uVar108 = uVar69;
      if ((int)uVar69 <= iVar85) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
      }
      pIVar73 = *(ImWchar **)(local_498._0_8_ + 0x38);
      if (pIVar73 == (ImWchar *)0x0) {
        pIVar73 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar111 + 0xd8) = pIVar73;
      IVar8 = *pIVar73;
      while (IVar8 != 0) {
        uVar58 = pIVar73[1];
        if (uVar58 == 0) break;
        uVar66 = (uint)uVar58;
        if ((int)(uint)uVar58 < (int)*(uint *)((long)pvVar111 + 0xe4)) {
          uVar66 = *(uint *)((long)pvVar111 + 0xe4);
        }
        *(uint *)((long)pvVar111 + 0xe4) = uVar66;
        IVar8 = pIVar73[2];
        pIVar73 = pIVar73 + 2;
      }
      piVar89 = (int *)((long)iVar85 * 0x20 + (long)pvVar71);
      *piVar89 = *piVar89 + 1;
      iVar85 = *(int *)((long)pvVar111 + 0xe4);
      if (*(int *)((long)pvVar111 + 0xe4) < piVar89[1]) {
        iVar85 = piVar89[1];
      }
      piVar89[1] = iVar85;
      lVar96 = local_468._0_8_ + 1;
      uVar70 = (ulong)(atlas->ConfigData).Size;
      sVar109 = local_3d8._0_8_;
    } while (lVar96 < (long)uVar70);
  }
  uVar70 = 0;
  if (0 < (int)uVar9) {
    lVar96 = 0;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_498._8_8_;
    local_498 = auVar130 << 0x40;
    uVar69 = uVar108;
    do {
      local_488._0_4_ = (float)lVar96;
      local_488._4_4_ = (float)((ulong)lVar96 >> 0x20);
      lVar96 = lVar96 * 0x110;
      iVar95 = *(int *)((long)pvVar200 + lVar96 + 0xe0);
      pvVar111 = pvVar200;
      if ((int)uVar69 <= iVar95) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        pvVar111 = pvVar200;
      }
      this_00 = (ImBitVector *)((long)pvVar111 + lVar96 + 0xf0);
      pvVar200 = pvVar111;
      ImBitVector::Create(this_00,*(int *)((long)pvVar111 + lVar96 + 0xe4) + 1);
      this = (ImBitVector *)((long)pvVar71 + (long)iVar95 * 0x20 + 0x10);
      if (*(int *)((long)pvVar71 + (long)iVar95 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)pvVar71 + (long)iVar95 * 0x20 + 4) + 1);
      }
      puVar90 = *(ushort **)((long)pvVar111 + lVar96 + 0xd8);
      uVar58 = *puVar90;
      for (; (uVar58 != 0 && (puVar90[1] != 0)); puVar90 = puVar90 + 2) {
        if (uVar58 <= puVar90[1]) {
          uVar66 = (uint)uVar58;
          do {
            bVar57 = ImBitVector::TestBit(this,uVar66);
            if ((!bVar57) &&
               (iVar85 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvVar111 + lVar96 + 8),
                                    *(int *)((long)pvVar111 + lVar96 + 0x34)), iVar85 != 0)) {
              piVar89 = (int *)((long)pvVar111 + lVar96 + 0xe8);
              *piVar89 = *piVar89 + 1;
              piVar89 = (int *)((long)pvVar71 + (long)iVar95 * 0x20 + 8);
              *piVar89 = *piVar89 + 1;
              ImBitVector::SetBit(this_00,uVar66);
              ImBitVector::SetBit(this,uVar66);
              auVar130 = local_498;
              iVar85 = local_498._0_4_;
              local_498._4_4_ = 0;
              local_498._0_4_ = iVar85 + 1;
              local_498._8_8_ = auVar130._8_8_;
            }
            bVar57 = uVar66 < puVar90[1];
            uVar66 = uVar66 + 1;
          } while (bVar57);
        }
        uVar58 = puVar90[2];
      }
      lVar96 = CONCAT44(local_488._4_4_,(float)local_488) + 1;
    } while (lVar96 != lVar83);
    uVar70 = local_498._0_8_;
    if (0 < (int)uVar9) {
      lVar96 = 0;
      pvVar111 = pvVar200;
      do {
        lVar74 = lVar96 * 0x110;
        iVar95 = *(int *)((long)pvVar111 + lVar74 + 0xe8);
        pvVar200 = pvVar111;
        if (*(int *)((long)pvVar111 + lVar74 + 0x104) < iVar95) {
          pvVar75 = ImGui::MemAlloc((long)iVar95 << 2);
          pvVar77 = *(void **)((long)pvVar111 + lVar74 + 0x108);
          if (pvVar77 != (void *)0x0) {
            memcpy(pvVar75,pvVar77,(long)*(int *)((long)pvVar111 + lVar74 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)pvVar111 + lVar74 + 0x108));
          }
          *(void **)((long)pvVar111 + lVar74 + 0x108) = pvVar75;
          *(int *)((long)pvVar111 + lVar74 + 0x104) = iVar95;
        }
        lVar76 = (long)*(int *)((long)pvVar111 + lVar74 + 0xf0);
        ptr_00 = *(uint **)((long)pvVar111 + lVar74 + 0xf8);
        if (0 < lVar76) {
          puVar1 = ptr_00 + lVar76;
          iVar95 = 0;
          do {
            local_488._0_4_ = SUB84(ptr_00,0);
            local_488._4_4_ = (float)((ulong)ptr_00 >> 0x20);
            uVar66 = *ptr_00;
            if (uVar66 != 0) {
              uVar108 = 0;
              do {
                if ((uVar66 >> (uVar108 & 0x1f) & 1) != 0) {
                  iVar85 = *(int *)((long)pvVar111 + lVar74 + 0x100);
                  if (iVar85 == *(int *)((long)pvVar111 + lVar74 + 0x104)) {
                    if (iVar85 == 0) {
                      iVar67 = 8;
                    }
                    else {
                      iVar67 = iVar85 / 2 + iVar85;
                    }
                    iVar110 = iVar85 + 1;
                    if (iVar85 + 1 < iVar67) {
                      iVar110 = iVar67;
                    }
                    pvVar77 = ImGui::MemAlloc((long)iVar110 << 2);
                    pvVar75 = *(void **)((long)pvVar111 + lVar74 + 0x108);
                    if (pvVar75 != (void *)0x0) {
                      memcpy(pvVar77,pvVar75,(long)*(int *)((long)pvVar111 + lVar74 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar111 + lVar74 + 0x108));
                    }
                    *(void **)((long)pvVar111 + lVar74 + 0x108) = pvVar77;
                    *(int *)((long)pvVar111 + lVar74 + 0x104) = iVar110;
                    iVar85 = *(int *)((long)pvVar111 + lVar74 + 0x100);
                  }
                  else {
                    pvVar77 = *(void **)((long)pvVar111 + lVar74 + 0x108);
                  }
                  *(uint *)((long)pvVar77 + (long)iVar85 * 4) = iVar95 + uVar108;
                  piVar89 = (int *)((long)pvVar111 + lVar74 + 0x100);
                  *piVar89 = *piVar89 + 1;
                }
                uVar108 = uVar108 + 1;
              } while (uVar108 != 0x20);
            }
            ptr_00 = (uint *)(CONCAT44(local_488._4_4_,(float)local_488) + 4);
            iVar95 = iVar95 + 0x20;
          } while (ptr_00 < puVar1);
          ptr_00 = *(uint **)((long)pvVar111 + lVar74 + 0xf8);
          uVar70 = local_498._0_8_;
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)pvVar111 + lVar74 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)pvVar111 + lVar74 + 0xf8) = 0;
        }
        if (*(int *)((long)pvVar111 + lVar74 + 0x100) != *(int *)((long)pvVar111 + lVar74 + 0xe8)) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                      ,0x87d,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s");
        }
        lVar96 = lVar96 + 1;
        pvVar111 = pvVar200;
      } while (lVar96 != lVar83);
    }
    sVar109 = local_3d8._0_8_;
  }
  if ((int)uVar69 < 1) {
    if (pvVar71 == (void *)0x0) goto LAB_001cac5c;
  }
  else {
    sVar91 = 0;
    do {
      pvVar111 = *(void **)((long)pvVar71 + sVar91 + 0x18);
      if (pvVar111 != (void *)0x0) {
        *(undefined8 *)((long)pvVar71 + sVar91 + 0x10) = 0;
        ImGui::MemFree(pvVar111);
        *(undefined8 *)((long)pvVar71 + sVar91 + 0x18) = 0;
      }
      sVar91 = sVar91 + 0x20;
    } while (sVar109 != sVar91);
  }
  ImGui::MemFree(pvVar71);
LAB_001cac5c:
  _local_418 = (stbtt__buf)ZEXT816(0);
  local_398 = 0;
  pvStack_390 = (void *)0x0;
  uVar69 = (uint)uVar70;
  if ((int)uVar69 < 1) {
    local_418._0_4_ = uVar69;
    pvVar71 = (void *)0x0;
  }
  else {
    uVar72 = 8;
    if (8 < uVar69) {
      uVar72 = uVar70 & 0xffffffff;
    }
    pvVar71 = ImGui::MemAlloc(uVar72 << 4);
    pvStack_410 = pvVar71;
    local_418._4_4_ = (int)uVar72;
    uVar72 = 8;
    if (8 < uVar69) {
      uVar72 = uVar70 & 0xffffffff;
    }
    local_418._0_4_ = uVar69;
    pvStack_390 = ImGui::MemAlloc(uVar72 * 0x1c);
    local_398 = uVar72 << 0x20;
  }
  pvVar111 = pvStack_390;
  local_398 = CONCAT44(local_398._4_4_,uVar69);
  memset(pvVar71,0,(long)(int)(uVar69 << 4));
  memset(pvVar111,0,(long)(int)(uVar69 * 0x1c));
  if ((int)uVar9 < 1) {
    fVar115 = 0.0;
  }
  else {
    local_438._0_8_ = pvVar111;
    lVar96 = 0;
    iVar67 = 0;
    iVar95 = 0;
    iVar85 = 0;
    local_498._0_8_ = uVar70;
    local_468._0_8_ = pvVar71;
    do {
      if (*(int *)((long)pvVar200 + lVar96 * 0x110 + 0xe8) != 0) {
        local_4e8 = (undefined1  [8])lVar96;
        if ((int)uVar70 <= iVar95) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        }
        psVar97 = (stbtt_fontinfo *)(lVar96 * 0x110 + (long)pvVar200);
        *(void **)&psVar97[1].hmtx = (void *)((long)iVar95 * 0x10 + (long)pvVar71);
        if ((int)uVar70 <= iVar85) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
        }
        lVar74 = (long)iVar85 * 0x1c + local_438._0_8_;
        *(long *)&psVar97[1].gpos = lVar74;
        iVar110 = psVar97[1].cff.cursor;
        pvVar71 = local_488;
        if ((atlas->ConfigData).Size <= lVar96) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s");
          lVar74._0_4_ = psVar97[1].gpos;
          lVar74._4_4_ = psVar97[1].index_map;
          pvVar71 = local_488;
        }
        pIVar13 = (atlas->ConfigData).Data;
        local_488._0_4_ = pIVar13[lVar96].SizePixels;
        *(float *)&psVar97[1].userdata = (float)local_488;
        *(undefined4 *)((long)&psVar97[1].userdata + 4) = 0;
        psVar97[1].data = *(uchar **)&psVar97[1].gsubrs.cursor;
        uVar69 = *(uint *)&psVar97[1].gsubrs.data;
        uVar72 = (ulong)uVar69;
        psVar97[1].fontstart = uVar69;
        psVar97[1].loca = (int)lVar74;
        psVar97[1].head = (int)((ulong)lVar74 >> 0x20);
        *(char *)&psVar97[1].glyf = (char)pIVar13[lVar96].OversampleH;
        *(char *)((long)&psVar97[1].glyf + 1) = (char)pIVar13[lVar96].OversampleV;
        if ((float)local_488 <= 0.0) {
          local_488._4_4_ = -0.0;
          fVar115 = -0.0;
          fVar116 = -0.0;
          local_488._0_4_ = -(float)local_488;
          uVar66 = (uint)(ushort)(*(ushort *)(psVar97->data + (long)psVar97->head + 0x12) << 8 |
                                 *(ushort *)(psVar97->data + (long)psVar97->head + 0x12) >> 8);
        }
        else {
          puVar78 = psVar97->data;
          lVar74 = (long)psVar97->hhea;
          uVar66 = ((int)(short)((ushort)puVar78[lVar74 + 4] << 8) | (uint)puVar78[lVar74 + 5]) -
                   ((int)(short)((ushort)puVar78[lVar74 + 6] << 8) | (uint)puVar78[lVar74 + 7]);
          local_488._4_4_ = 0.0;
          fVar115 = 0.0;
          fVar116 = 0.0;
        }
        local_488._0_4_ = (float)local_488 / (float)(int)uVar66;
        iVar95 = iVar95 + iVar110;
        iVar85 = iVar85 + iVar110;
        if (0 < (int)uVar69) {
          iVar110 = atlas->TexGlyphPadding;
          lVar74 = 6;
          lVar76 = 0;
          fStack_480 = fVar115;
          fStack_47c = fVar116;
          do {
            if ((int)uVar72 <= lVar76) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            iVar68 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar97->data,psVar97->index_map);
            if (iVar68 == 0) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                          ,0x8ac,"ImFontAtlasBuildWithStbTruetype","ImGui ASSERT FAILED: %s",
                          "glyph_index_in_font != 0");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar97,iVar68,(float)pIVar13[lVar96].OversampleH * (float)local_488,
                       (float)pIVar13[lVar96].OversampleV * (float)local_488,(float)local_488,
                       in_XMM3._0_4_,(int *)local_238,(int *)local_470,(int *)&local_400,
                       (int *)&local_49c);
            uVar69 = (pIVar13[lVar96].OversampleH +
                     (((stbtt_uint32)local_400 + iVar110) - (int)local_238[0].data)) - 1;
            lVar86 = *(long *)&psVar97[1].hmtx;
            *(short *)(lVar86 + -2 + lVar74) = (short)uVar69;
            uVar66 = (pIVar13[lVar96].OversampleV + ((local_49c + iVar110) - local_470._0_4_)) - 1;
            *(short *)(lVar86 + lVar74) = (short)uVar66;
            iVar67 = iVar67 + (uVar66 & 0xffff) * (uVar69 & 0xffff);
            lVar76 = lVar76 + 1;
            uVar72 = (ulong)*(int *)&psVar97[1].gsubrs.data;
            lVar74 = lVar74 + 0x10;
          } while (lVar76 < (long)uVar72);
          uVar70 = local_498._0_8_;
          pvVar71 = (void *)CONCAT44(local_488._4_4_,(float)local_488);
        }
        local_488 = pvVar71;
        pvVar71 = (void *)local_468._0_8_;
      }
      lVar96 = lVar96 + 1;
    } while (lVar96 != lVar83);
    fVar115 = (float)iVar67;
  }
  atlas->TexHeight = 0;
  iVar95 = atlas->TexDesiredWidth;
  if (iVar95 < 1) {
    iVar85 = (int)SQRT(fVar115);
    iVar95 = 0x1000;
    if ((iVar85 < 0xb33) && (iVar95 = 0x800, iVar85 < 0x599)) {
      iVar95 = (uint)(0x2cb < iVar85) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar95;
  uVar69 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar66 = iVar95 - uVar69;
  local_458 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar66 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_458 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_458 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_458);
    }
    local_458 = (stbrp_node *)0x0;
    uVar69 = 0;
    iVar95 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar69 < -0x7fff) || (0xffff < (int)uVar66)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                  ,0x10a,"stbrp_init_target","ImGui ASSERT FAILED: %s");
    }
    auVar164 = _DAT_0027b3b0;
    auVar130 = _DAT_00246490;
    if ((int)uVar66 < 2) {
      uVar70 = 0;
    }
    else {
      uVar70 = (ulong)(uVar66 - 1);
      uVar72 = (ulong)(uVar66 & 0x7ffffffe);
      lVar96 = uVar70 - 1;
      auVar118._8_4_ = (int)lVar96;
      auVar118._0_8_ = lVar96;
      auVar118._12_4_ = (int)((ulong)lVar96 >> 0x20);
      ppsVar100 = &local_458[1].next;
      auVar118 = auVar118 ^ _DAT_00246490;
      auVar142._8_4_ = 0xffffffff;
      auVar142._0_8_ = 0xffffffffffffffff;
      auVar142._12_4_ = 0xffffffff;
      auVar174 = _DAT_00246480;
      do {
        auVar148 = auVar174 ^ auVar130;
        auVar152._0_4_ = -(uint)(auVar118._0_4_ < auVar148._0_4_);
        auVar152._4_4_ = -(uint)(auVar118._4_4_ < auVar148._4_4_);
        auVar152._8_4_ = -(uint)(auVar118._8_4_ < auVar148._8_4_);
        auVar152._12_4_ = -(uint)(auVar118._12_4_ < auVar148._12_4_);
        auVar149._4_4_ = -(uint)(auVar148._4_4_ == auVar118._4_4_);
        auVar149._12_4_ = -(uint)(auVar148._12_4_ == auVar118._12_4_);
        auVar149._0_4_ = auVar149._4_4_;
        auVar149._8_4_ = auVar149._12_4_;
        auVar148._4_4_ = auVar152._4_4_;
        auVar148._0_4_ = auVar152._4_4_;
        auVar148._8_4_ = auVar152._12_4_;
        auVar148._12_4_ = auVar152._12_4_;
        auVar148 = auVar148 | auVar149 & auVar152;
        lVar96 = auVar174._8_8_;
        if ((~auVar148._0_4_ & 1) != 0) {
          ppsVar100[-2] = local_458 + auVar174._0_8_ + 1;
        }
        if (((auVar148 ^ auVar142) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar100 = local_458 + (lVar96 - auVar142._8_8_);
        }
        auVar174._0_8_ = auVar174._0_8_ + auVar164._0_8_;
        auVar174._8_8_ = lVar96 + auVar164._8_8_;
        ppsVar100 = ppsVar100 + 4;
        uVar72 = uVar72 - 2;
      } while (uVar72 != 0);
    }
    local_458[uVar70].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_458;
    ptr->active_head = ptr->extra;
    ptr->width = uVar66;
    ptr->height = 0x8000 - uVar69;
    ptr->num_nodes = uVar66;
    ptr->align = (int)((uVar66 - 1) + uVar66) / (int)uVar66;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar66;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_340 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < (int)uVar9) {
    lVar96 = 0;
    pvVar71 = pvVar200;
    do {
      lVar74 = lVar96 * 0x110;
      iVar85 = *(int *)((long)pvVar71 + lVar74 + 0xe8);
      pvVar200 = pvVar71;
      if (iVar85 != 0) {
        stbrp_pack_rects(local_340,*(stbrp_rect **)((long)pvVar71 + lVar74 + 200),iVar85);
        lVar76 = (long)*(int *)((long)pvVar71 + lVar74 + 0xe8);
        if (0 < lVar76) {
          lVar74 = *(long *)((long)pvVar71 + lVar74 + 200);
          lVar86 = 0;
          do {
            if (*(int *)(lVar74 + 0xc + lVar86) != 0) {
              iVar85 = (uint)*(ushort *)(lVar74 + 6 + lVar86) +
                       (uint)*(ushort *)(lVar74 + 10 + lVar86);
              if (iVar85 < atlas->TexHeight) {
                iVar85 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar85;
            }
            lVar86 = lVar86 + 0x10;
          } while (lVar76 * 0x10 != lVar86);
        }
      }
      lVar96 = lVar96 + 1;
      pvVar71 = pvVar200;
    } while (lVar96 != lVar83);
  }
  uVar66 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar66 = (int)(uVar66 - 1) >> 1 | uVar66 - 1;
    uVar66 = (int)uVar66 >> 2 | uVar66;
    uVar66 = (int)uVar66 >> 4 | uVar66;
    uVar66 = (int)uVar66 >> 8 | uVar66;
    uVar66 = (int)uVar66 >> 0x10 | uVar66;
  }
  iVar85 = uVar66 + 1;
  atlas->TexHeight = iVar85;
  auVar164._0_4_ = (float)atlas->TexWidth;
  auVar164._4_4_ = (float)iVar85;
  auVar164._8_8_ = 0;
  auVar130 = divps(_DAT_0024a360,auVar164);
  atlas->TexUvScale = auVar130._0_8_;
  puVar78 = (uchar *)ImGui::MemAlloc((long)(iVar85 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar78;
  memset(puVar78,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar9) {
    local_388 = atlas->TexPixelsAlpha8;
    local_498._0_8_ = (long)iVar95;
    local_298 = pshuflw(ZEXT416(uVar69),ZEXT416(uVar69),0);
    lVar96 = 0;
    local_478 = iVar95;
    do {
      if ((atlas->ConfigData).Size <= lVar96) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      if (*(int *)((long)pvVar200 + lVar96 * 0x110 + 0xe8) != 0) {
        psVar97 = (stbtt_fontinfo *)(lVar96 * 0x110 + (long)pvVar200);
        fVar115 = *(float *)&psVar97[1].userdata;
        if (fVar115 <= 0.0) {
          auVar131._4_4_ = 0x80000000;
          auVar131._0_4_ = -fVar115;
          auVar131._8_4_ = 0x80000000;
          auVar131._12_4_ = 0x80000000;
          uVar69 = (uint)(ushort)(*(ushort *)(psVar97->data + (long)psVar97->head + 0x12) << 8 |
                                 *(ushort *)(psVar97->data + (long)psVar97->head + 0x12) >> 8);
        }
        else {
          puVar78 = psVar97->data;
          lVar74 = (long)psVar97->hhea;
          uVar69 = ((int)(short)((ushort)puVar78[lVar74 + 4] << 8) | (uint)puVar78[lVar74 + 5]) -
                   ((int)(short)((ushort)puVar78[lVar74 + 6] << 8) | (uint)puVar78[lVar74 + 7]);
          auVar131 = ZEXT416((uint)fVar115);
        }
        local_318._4_12_ = auVar131._4_12_;
        local_318._0_4_ = auVar131._0_4_ / (float)(int)uVar69;
        local_300 = (atlas->ConfigData).Data;
        iVar85 = psVar97[1].fontstart;
        if (0 < iVar85) {
          lVar76._0_4_ = psVar97[1].hmtx;
          lVar76._4_4_ = psVar97[1].kern;
          uVar70._0_4_ = psVar97[1].glyf;
          uVar70._4_4_ = psVar97[1].hhea;
          auVar31._8_6_ = 0;
          auVar31._0_8_ = uVar70;
          auVar31[0xe] = (char)((uint)uVar70._4_4_ >> 0x18);
          auVar33._8_4_ = 0;
          auVar33._0_8_ = uVar70;
          auVar33[0xc] = (char)((uint)uVar70._4_4_ >> 0x10);
          auVar33._13_2_ = auVar31._13_2_;
          auVar34._8_4_ = 0;
          auVar34._0_8_ = uVar70;
          auVar34._12_3_ = auVar33._12_3_;
          auVar35._8_2_ = 0;
          auVar35._0_8_ = uVar70;
          auVar35[10] = (char)((uint)uVar70._4_4_ >> 8);
          auVar35._11_4_ = auVar34._11_4_;
          auVar38._8_2_ = 0;
          auVar38._0_8_ = uVar70;
          auVar38._10_5_ = auVar35._10_5_;
          auVar39[8] = (char)uVar70._4_4_;
          auVar39._0_8_ = uVar70;
          auVar39._9_6_ = auVar38._9_6_;
          auVar42._7_8_ = 0;
          auVar42._0_7_ = auVar39._8_7_;
          cVar125 = (char)((uint)(undefined4)uVar70 >> 0x18);
          Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),cVar125);
          auVar50._9_6_ = 0;
          auVar50._0_9_ = Var43;
          cVar122 = (char)((uint)(undefined4)uVar70 >> 0x10);
          auVar40[4] = cVar122;
          auVar40._0_4_ = (undefined4)uVar70;
          auVar40._5_10_ = SUB1510(auVar50 << 0x30,5);
          auVar44._11_4_ = 0;
          auVar44._0_11_ = auVar40._4_11_;
          cVar121 = (char)((uint)(undefined4)uVar70 >> 8);
          auVar45._1_12_ = SUB1512(auVar44 << 0x20,3);
          auVar45[0] = cVar121;
          bVar113 = (byte)(undefined4)uVar70;
          uVar58 = CONCAT11(0,bVar113);
          auVar41._2_13_ = auVar45;
          auVar41._0_2_ = uVar58;
          uVar123 = auVar45._0_2_;
          sVar114 = -auVar40._4_2_;
          sVar126 = (short)Var43;
          sVar124 = -sVar126;
          auVar32._10_2_ = 0;
          auVar32._0_10_ = auVar41._0_10_;
          auVar32._12_2_ = sVar126;
          uVar52 = CONCAT42(auVar32._10_4_,auVar40._4_2_);
          auVar46._6_8_ = 0;
          auVar46._0_6_ = uVar52;
          auVar36._4_2_ = uVar123;
          auVar36._0_4_ = auVar41._0_4_;
          auVar36._6_8_ = SUB148(auVar46 << 0x40,6);
          auVar119._0_4_ = (float)uVar58;
          auVar119._4_4_ = (float)auVar36._4_4_;
          auVar119._8_4_ = (float)(int)uVar52;
          auVar119._12_4_ = (float)(auVar32._10_4_ >> 0x10);
          local_268 = divps(_DAT_0024a360,auVar119);
          auVar146[0] = -(bVar113 == 0);
          auVar146[1] = -(bVar113 == 0);
          auVar146[2] = -(bVar113 == 0);
          auVar146[3] = -(bVar113 == 0);
          auVar146[4] = -(cVar121 == '\0');
          auVar146[5] = -(cVar121 == '\0');
          auVar146[6] = -(cVar121 == '\0');
          auVar146[7] = -(cVar121 == '\0');
          auVar146[8] = -(cVar122 == '\0');
          auVar146[9] = -(cVar122 == '\0');
          auVar146[10] = -(cVar122 == '\0');
          auVar146[0xb] = -(cVar122 == '\0');
          auVar146[0xc] = -(cVar125 == '\0');
          auVar146[0xd] = -(cVar125 == '\0');
          auVar146[0xe] = -(cVar125 == '\0');
          auVar146[0xf] = -(cVar125 == '\0');
          Var51 = CONCAT64(CONCAT42(CONCAT22(sVar124,sVar124),sVar114),CONCAT22(sVar114,sVar124));
          auVar47._4_8_ = (long)((unkuint10)Var51 >> 0x10);
          auVar47._2_2_ = 1 - uVar123;
          auVar47._0_2_ = 1 - uVar123;
          auVar132._0_4_ = (float)(int)(short)(1 - uVar58);
          auVar132._4_4_ = (float)(auVar47._0_4_ >> 0x10);
          auVar132._8_4_ = (float)((int)((unkuint10)Var51 >> 0x10) >> 0x10);
          auVar132._12_4_ = (float)(int)sVar124;
          auVar143._0_4_ = (float)local_318._0_4_ * auVar119._0_4_;
          auVar143._4_4_ = (float)local_318._0_4_ * auVar119._4_4_;
          auVar143._8_4_ = (float)local_318._0_4_ * auVar119._8_4_;
          auVar143._12_4_ = (float)local_318._0_4_ * auVar119._12_4_;
          auVar120._0_4_ = auVar119._0_4_ + auVar119._0_4_;
          auVar120._4_4_ = auVar119._4_4_ + auVar119._4_4_;
          auVar120._8_4_ = auVar119._8_4_ + auVar119._8_4_;
          auVar120._12_4_ = auVar119._12_4_ + auVar119._12_4_;
          auVar130 = divps(auVar132,auVar120);
          fVar115 = auVar143._4_4_;
          if (auVar143._0_4_ <= auVar143._4_4_) {
            fVar115 = auVar143._0_4_;
          }
          local_3a4 = (0.35 / fVar115) * (0.35 / fVar115);
          local_2b8 = auVar143._4_4_;
          fStack_2b4 = auVar143._4_4_;
          fStack_2b0 = auVar143._4_4_;
          fStack_2ac = auVar143._4_4_;
          local_320 = (ulong)((undefined4)uVar70 & 0xff);
          local_328 = (ulong)((uint)(undefined4)uVar70 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar146 & auVar130;
          local_288._4_4_ = SUB164(~auVar146 & auVar130,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_488._0_4_ = (float)(auVar41._0_4_ & 0xff);
          local_488._4_4_ = 0.0;
          local_2a8 = auVar143;
          uVar70 = CONCAT44(auVar143._4_4_,auVar143._0_4_);
          local_248 = uVar70 ^ 0x8000000000000000;
          fStack_240 = auVar143._0_4_;
          fStack_23c = -auVar143._4_4_;
          lVar74 = 0;
          local_370 = lVar96;
          local_3f0 = psVar97;
          local_2d8 = lVar76;
          do {
            if (((*(int *)(lVar76 + 0xc + lVar74 * 0x10) != 0) &&
                (lVar86 = lVar74 * 0x10 + lVar76, *(short *)(lVar86 + 4) != 0)) &&
               (*(short *)(lVar86 + 6) != 0)) {
              local_2d0 = (short *)(lVar74 * 0x1c + *(long *)&psVar97[1].loca);
              local_3b8 = lVar86;
              local_2c8 = lVar74;
              iVar67 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar97->data,psVar97->index_map);
              uVar161 = *(undefined8 *)(local_3b8 + 4);
              *(ulong *)(local_3b8 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar161 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar161 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar161 >> 0x10) - local_298._2_2_,
                                     (short)uVar161 - local_298._0_2_));
              puVar78 = local_3f0->data;
              uVar58 = *(ushort *)(puVar78 + (long)local_3f0->hhea + 0x22) << 8 |
                       *(ushort *)(puVar78 + (long)local_3f0->hhea + 0x22) >> 8;
              iVar85 = local_3f0->hmtx;
              lVar96 = (ulong)uVar58 * 4 + (long)iVar85 + -4;
              lVar74 = (ulong)uVar58 * 4 + (long)iVar85 + -3;
              if (iVar67 < (int)(uint)uVar58) {
                lVar96 = (long)(iVar67 * 4) + (long)iVar85;
                lVar74 = (long)(iVar67 * 4) + 1 + (long)iVar85;
              }
              local_358 = (uint)puVar78[lVar74];
              local_354 = (uint)puVar78[lVar96];
              auVar130 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3f0,iVar67,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar143._0_4_,&local_348,&local_34c,&local_2bc,&local_2c0);
              fVar115 = auVar130._0_4_;
              uVar58 = *(ushort *)(local_3b8 + 8);
              uVar84 = *(ushort *)(local_3b8 + 10);
              local_420 = (ulong)*(ushort *)(local_3b8 + 4);
              local_3c0 = (ulong)*(ushort *)(local_3b8 + 6);
              uVar69 = stbtt_GetGlyphShape(local_3f0,iVar67,(stbtt_vertex **)&local_400);
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3f0,iVar67,(float)local_2a8._0_4_,local_2b8,fVar115,auVar143._0_4_,
                         (int *)&local_49c,&local_344,(int *)0x0,(int *)0x0);
              local_3f4 = ((int)local_420 - (int)(float)local_488) + 1;
              uVar66 = (uint)uVar123;
              if (local_3f4 != 0) {
                iVar85 = ((int)local_3c0 - uVar66) + 1;
                local_4e8._0_4_ = iVar85;
                if ((iVar85 != 0) && (0 < (int)uVar69)) {
                  local_2e0 = local_388 + (ulong)uVar84 * local_498._0_8_ + (ulong)uVar58;
                  local_420 = (ulong)(uint)((int)local_420 - (int)(float)local_488);
                  local_3c0 = (ulong)((int)local_3c0 - uVar66);
                  lVar96 = CONCAT44(local_400._4_4_,(stbtt_uint32)local_400);
                  local_43c = local_344;
                  lVar74 = 0;
                  uVar108 = 0;
                  do {
                    uVar108 = uVar108 + (*(char *)(lVar96 + 0xc + lVar74) == '\x01');
                    lVar74 = lVar74 + 0xe;
                  } while ((ulong)uVar69 * 0xe != lVar74);
                  if (uVar108 != 0) {
                    uVar70 = (ulong)uVar108;
                    sVar61 = local_49c;
                    pvVar71 = ImGui::MemAlloc(uVar70 * 4);
                    if (pvVar71 != (void *)0x0) {
                      bVar82 = false;
                      iVar67 = 0;
                      local_448 = (stbtt__point *)0x0;
                      iVar110 = 0;
                      bVar57 = true;
                      local_408 = pvVar71;
                      do {
                        bVar94 = bVar57;
                        if ((bVar82) &&
                           (local_448 = (stbtt__point *)ImGui::MemAlloc((long)iVar110 << 3),
                           local_448 == (stbtt__point *)0x0)) {
                          ImGui::MemFree((void *)0x0);
                          iVar95 = local_478;
                          ImGui::MemFree(local_408);
                          goto LAB_001ccaa9;
                        }
                        local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000)
                        ;
                        fVar115 = 0.0;
                        fVar116 = 0.0;
                        uVar72 = 0xffffffff;
                        lVar74 = 0;
                        do {
                          iVar95 = (int)local_238[0].data;
                          switch(*(undefined1 *)(lVar96 + 0xc + lVar74)) {
                          case 1:
                            if (-1 < (int)uVar72) {
                              *(int *)((long)local_408 + uVar72 * 4) =
                                   (int)local_238[0].data - iVar67;
                            }
                            uVar72 = (ulong)((int)uVar72 + 1);
                            auVar130 = pshuflw(ZEXT416(*(uint *)(lVar96 + lVar74)),
                                               ZEXT416(*(uint *)(lVar96 + lVar74)),0x60);
                            fVar115 = (float)(auVar130._0_4_ >> 0x10);
                            fVar116 = (float)(auVar130._4_4_ >> 0x10);
                            local_238[0].data =
                                 (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                   (int)local_238[0].data + 1);
                            iVar67 = iVar95;
                            if (local_448 != (stbtt__point *)0x0) {
                              local_448[iVar95].x = fVar115;
                              local_448[iVar95].y = fVar116;
                            }
                            break;
                          case 2:
                            lVar76 = (long)(int)local_238[0].data;
                            auVar130 = pshuflw(ZEXT416(*(uint *)(lVar96 + lVar74)),
                                               ZEXT416(*(uint *)(lVar96 + lVar74)),0x60);
                            fVar115 = (float)(auVar130._0_4_ >> 0x10);
                            fVar116 = (float)(auVar130._4_4_ >> 0x10);
                            local_238[0].data =
                                 (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                   (int)local_238[0].data + 1);
                            if (local_448 != (stbtt__point *)0x0) {
                              local_448[lVar76].x = fVar115;
                              local_448[lVar76].y = fVar116;
                            }
                            break;
                          case 3:
                            fVar141 = (float)(int)*(short *)(lVar96 + 6 + lVar74);
                            auVar143 = ZEXT416((uint)fVar141);
                            stbtt__tesselate_curve
                                      (local_448,(int *)local_238,fVar115,fVar116,
                                       (float)(int)*(short *)(lVar96 + 4 + lVar74),fVar141,
                                       (float)(int)*(short *)(lVar96 + lVar74),
                                       (float)(int)*(short *)(lVar96 + 2 + lVar74),local_3a4,0);
                            goto LAB_001cbae7;
                          case 4:
                            fVar141 = (float)(int)*(short *)(lVar96 + 6 + lVar74);
                            auVar143 = ZEXT416((uint)fVar141);
                            stbtt__tesselate_cubic
                                      (local_448,(int *)local_238,fVar115,fVar116,
                                       (float)(int)*(short *)(lVar96 + 4 + lVar74),fVar141,
                                       (float)(int)*(short *)(lVar96 + 8 + lVar74),
                                       (float)(int)*(short *)(lVar96 + 10 + lVar74),
                                       (float)(int)*(short *)(lVar96 + lVar74),
                                       (float)(int)*(short *)(lVar96 + 2 + lVar74),local_3a4,0);
LAB_001cbae7:
                            auVar130 = pshuflw(ZEXT416(*(uint *)(lVar96 + lVar74)),
                                               ZEXT416(*(uint *)(lVar96 + lVar74)),0x60);
                            fVar115 = (float)(auVar130._0_4_ >> 0x10);
                            fVar116 = (float)(auVar130._4_4_ >> 0x10);
                          }
                          pvVar71 = local_408;
                          iVar95 = local_478;
                          lVar74 = lVar74 + 0xe;
                        } while ((ulong)uVar69 * 0xe != lVar74);
                        *(int *)((long)local_408 + (long)(int)uVar72 * 4) =
                             (int)local_238[0].data - iVar67;
                        bVar82 = true;
                        iVar110 = (int)local_238[0].data;
                        bVar57 = false;
                      } while (bVar94);
                      if (local_448 != (stbtt__point *)0x0) {
                        uVar72 = 0;
                        lVar96 = 0;
                        do {
                          lVar96 = (long)(int)lVar96 + (long)*(int *)((long)local_408 + uVar72 * 4);
                          uVar72 = uVar72 + 1;
                        } while (uVar70 != uVar72);
                        local_450 = (stbtt__edge *)ImGui::MemAlloc(lVar96 * 0x14 + 0x14);
                        pvVar111 = local_408;
                        if (local_450 != (stbtt__edge *)0x0) {
                          uVar72 = 0;
                          uVar93 = 0;
                          iVar67 = 0;
                          do {
                            iVar110 = *(int *)((long)pvVar71 + uVar72 * 4);
                            if (0 < iVar110) {
                              uVar104 = (ulong)(iVar110 - 1);
                              uVar102 = 0;
                              iVar68 = iVar110;
                              do {
                                iVar103 = (int)uVar104;
                                fVar115 = local_448[(long)iVar67 + (long)iVar103].y;
                                fVar116 = local_448[(long)iVar67 + uVar102].y;
                                if ((fVar115 != fVar116) || (NAN(fVar115) || NAN(fVar116))) {
                                  iVar68 = (int)uVar102;
                                  iVar95 = iVar103;
                                  if (fVar115 <= fVar116) {
                                    iVar95 = iVar68;
                                    iVar68 = iVar103;
                                  }
                                  iVar103 = (int)uVar93;
                                  local_450[iVar103].invert = (uint)(fVar116 < fVar115);
                                  sVar3 = local_448[(long)iVar67 + (long)iVar95];
                                  sVar4 = local_448[(long)iVar67 + (long)iVar68];
                                  psVar92 = local_450 + iVar103;
                                  psVar92->x0 = sVar3.x * (float)local_248._0_4_ + 0.0;
                                  psVar92->y0 = sVar3.y * (float)local_248._4_4_ + 0.0;
                                  psVar92->x1 = sVar4.x * fStack_240 + 0.0;
                                  psVar92->y1 = sVar4.y * fStack_23c + 0.0;
                                  uVar93 = (ulong)(iVar103 + 1);
                                  iVar68 = *(int *)((long)local_408 + uVar72 * 4);
                                  iVar95 = local_478;
                                }
                                uVar104 = uVar102 & 0xffffffff;
                                uVar102 = uVar102 + 1;
                              } while ((long)uVar102 < (long)iVar68);
                            }
                            iVar67 = iVar67 + iVar110;
                            uVar72 = uVar72 + 1;
                            pvVar71 = local_408;
                          } while (uVar72 != uVar70);
                          iVar67 = (int)uVar93;
                          stbtt__sort_edges_quicksort(local_450,iVar67);
                          if (1 < iVar67) {
                            uVar70 = 1;
                            lVar96 = 2;
                            psVar92 = local_450;
                            do {
                              uVar2 = local_450[uVar70].x0;
                              uVar5 = local_450[uVar70].y0;
                              iVar110 = local_450[uVar70].invert;
                              local_238[0].cursor = iVar110;
                              local_238[0].data = *(uchar **)&local_450[uVar70].x1;
                              lVar74 = lVar96;
                              psVar101 = psVar92;
                              do {
                                if (psVar101->y0 <= (float)uVar5) {
                                  uVar69 = (int)lVar74 - 1;
                                  goto LAB_001cbd4f;
                                }
                                psVar101[1].invert = psVar101->invert;
                                fVar115 = psVar101->y0;
                                fVar116 = psVar101->x1;
                                fVar141 = psVar101->y1;
                                psVar101[1].x0 = psVar101->x0;
                                psVar101[1].y0 = fVar115;
                                psVar101[1].x1 = fVar116;
                                psVar101[1].y1 = fVar141;
                                lVar74 = lVar74 + -1;
                                psVar101 = psVar101 + -1;
                              } while (1 < lVar74);
                              uVar69 = 0;
LAB_001cbd4f:
                              if (uVar70 != uVar69) {
                                local_450[(int)uVar69].x0 = (float)uVar2;
                                local_450[(int)uVar69].y0 = (float)uVar5;
                                *(uchar **)&local_450[(int)uVar69].x1 = local_238[0].data;
                                local_450[(int)uVar69].invert = iVar110;
                              }
                              uVar70 = uVar70 + 1;
                              lVar96 = lVar96 + 1;
                              psVar92 = psVar92 + 1;
                            } while (uVar70 != uVar93);
                          }
                          local_470 = (undefined1  [8])0x0;
                          scanline = local_238;
                          if (0x3f < (int)(uint)local_420) {
                            scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3f4 * 8 + 4);
                          }
                          local_450[iVar67].y0 = (float)(iVar85 + local_43c) + 1.0;
                          if ((uint)local_3c0 < 0x7fffffff) {
                            local_2f8 = (long)(int)local_3f4;
                            local_350 = (float)(int)sVar61;
                            local_330 = (float *)((long)&scanline->data + local_2f8 * 4);
                            local_338 = local_330 + 1;
                            local_2e8 = local_2f8 * 4;
                            local_2f0 = (long)(int)(uint)local_420 * 4 + 8;
                            local_3f8 = (float)(int)local_3f4;
                            local_380 = 0;
                            local_378 = 0;
                            local_3a0 = (undefined8 *)0x0;
                            local_368 = 0;
                            local_3b0 = (stbtt__active_edge *)0x0;
                            psVar92 = local_450;
                            auVar106 = (undefined1  [8])(stbtt__active_edge *)0x0;
                            iVar85 = local_43c;
                            do {
                              fVar115 = (float)iVar85;
                              fVar116 = fVar115 + 1.0;
                              local_35c = iVar85;
                              memset(scanline,0,local_2e8);
                              memset(local_330,0,local_2f0);
                              iVar85 = local_43c;
                              if (auVar106 != (undefined1  [8])0x0) {
                                psVar81 = (stbtt__active_edge *)local_470;
                                do {
                                  if (((stbtt__active_edge *)auVar106)->ey <= fVar115) {
                                    psVar81->next = ((stbtt__active_edge *)auVar106)->next;
                                    if ((((stbtt__active_edge *)auVar106)->direction == 0.0) &&
                                       (!NAN(((stbtt__active_edge *)auVar106)->direction))) {
                                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xc63,"stbtt__rasterize_sorted_edges",
                                                  "ImGui ASSERT FAILED: %s","bool(z->direction)");
                                    }
                                    ((stbtt__active_edge *)auVar106)->direction = 0.0;
                                    ((stbtt__active_edge *)auVar106)->next = local_3b0;
                                    local_3b0 = (stbtt__active_edge *)auVar106;
                                    auVar106 = (undefined1  [8])psVar81;
                                    iVar85 = local_43c;
                                  }
                                  ppsVar56 = &((stbtt__active_edge *)auVar106)->next;
                                  psVar81 = (stbtt__active_edge *)auVar106;
                                  auVar106 = (undefined1  [8])*ppsVar56;
                                } while (*ppsVar56 != (stbtt__active_edge *)0x0);
                              }
                              fVar141 = psVar92->y0;
                              psVar81 = local_3b0;
                              if (fVar141 <= fVar116) {
                                bVar57 = (int)local_378 == 0;
                                do {
                                  fVar138 = psVar92->y1;
                                  if ((fVar141 != fVar138) || (NAN(fVar141) || NAN(fVar138))) {
                                    if (psVar81 == (stbtt__active_edge *)0x0) {
                                      if ((int)local_368 == 0) {
                                        puVar80 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                        if (puVar80 == (undefined8 *)0x0) {
                                          local_368 = 0;
                                          LogFatalMsg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xad1,"stbtt__new_active",
                                                  "ImGui ASSERT FAILED: %s","z != __null");
                                          psVar81 = (stbtt__active_edge *)0x0;
                                          goto LAB_001cc9d8;
                                        }
                                        *puVar80 = local_3a0;
                                        fVar141 = psVar92->y0;
                                        fVar138 = psVar92->y1;
                                        local_368 = 799;
                                        local_3a0 = puVar80;
                                      }
                                      else {
                                        local_368 = (ulong)((int)local_368 - 1);
                                      }
                                      psVar107 = (stbtt__active_edge *)
                                                 (local_3a0 + (long)(int)local_368 * 4 + 1);
                                      psVar81 = (stbtt__active_edge *)0x0;
                                    }
                                    else {
                                      psVar107 = psVar81;
                                      psVar81 = psVar81->next;
                                    }
                                    fVar145 = psVar92->x0;
                                    fVar117 = (psVar92->x1 - fVar145) / (fVar138 - fVar141);
                                    psVar107->fdx = fVar117;
                                    psVar107->fdy =
                                         (float)(-(uint)(fVar117 != 0.0) & (uint)(1.0 / fVar117));
                                    psVar107->fx = ((fVar115 - fVar141) * fVar117 + fVar145) -
                                                   local_350;
                                    psVar107->direction =
                                         *(float *)(&DAT_0027b52c +
                                                   (ulong)(psVar92->invert == 0) * 4);
                                    psVar107->sy = fVar141;
                                    psVar107->ey = fVar138;
                                    psVar107->next = (stbtt__active_edge *)0x0;
                                    if (fVar138 < fVar115 && (bVar57 && iVar85 != 0)) {
                                      psVar107->ey = fVar115;
                                      fVar138 = fVar115;
                                    }
                                    if (fVar138 < fVar115) {
                                      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xc76,"stbtt__rasterize_sorted_edges",
                                                  "ImGui ASSERT FAILED: %s","z->ey >= scan_y_top");
                                    }
                                    psVar107->next = (stbtt__active_edge *)local_470;
                                    local_470 = (undefined1  [8])psVar107;
                                  }
LAB_001cc9d8:
                                  fVar141 = psVar92[1].y0;
                                  psVar92 = psVar92 + 1;
                                } while (fVar141 <= fVar116);
                              }
                              local_3b0 = psVar81;
                              for (auVar106 = local_470; pvVar111 = local_408,
                                  auVar106 != (undefined1  [8])0x0;
                                  auVar106 = (undefined1  [8])((stbtt__active_edge *)auVar106)->next
                                  ) {
                                if (((stbtt__active_edge *)auVar106)->ey < fVar115) {
                                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                              ,0xba5,"stbtt__fill_active_edges_new",
                                              "ImGui ASSERT FAILED: %s","e->ey >= y_top");
                                }
                                fVar141 = ((stbtt__active_edge *)auVar106)->fx;
                                fVar138 = ((stbtt__active_edge *)auVar106)->fdx;
                                local_468 = ZEXT416((uint)fVar141);
                                if ((fVar138 != 0.0) || (NAN(fVar138))) {
                                  local_3e8 = ZEXT416((uint)((stbtt__active_edge *)auVar106)->fdy);
                                  fVar141 = ((stbtt__active_edge *)auVar106)->sy;
                                  local_474 = fVar138;
                                  if (fVar116 < fVar141) {
LAB_001cc0f1:
                                    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                ,3000,"stbtt__fill_active_edges_new",
                                                "ImGui ASSERT FAILED: %s",
                                                "e->sy <= y_bottom && e->ey >= y_top");
                                    fVar141 = ((stbtt__active_edge *)auVar106)->sy;
                                    local_4e8._0_4_ = ((stbtt__active_edge *)auVar106)->ey;
                                  }
                                  else {
                                    local_4e8._0_4_ = ((stbtt__active_edge *)auVar106)->ey;
                                    if (((stbtt__active_edge *)auVar106)->ey < fVar115)
                                    goto LAB_001cc0f1;
                                  }
                                  fVar138 = local_468._0_4_;
                                  fVar117 = local_474 + fVar138;
                                  local_438 = ZEXT416((uint)fVar117);
                                  fVar145 = (float)(~-(uint)(fVar115 < fVar141) & (uint)fVar138 |
                                                   (uint)((fVar141 - fVar115) * local_474 + fVar138)
                                                   & -(uint)(fVar115 < fVar141));
                                  if (0.0 <= fVar145) {
                                    fVar155 = (float)(~-(uint)((float)local_4e8._0_4_ < fVar116) &
                                                      (uint)fVar117 |
                                                     (uint)(((float)local_4e8._0_4_ - fVar115) *
                                                            local_474 + fVar138) &
                                                     -(uint)((float)local_4e8._0_4_ < fVar116));
                                    if (((0.0 <= fVar155) && (fVar145 < local_3f8)) &&
                                       (fVar155 < local_3f8)) {
                                      if (fVar141 <= fVar115) {
                                        fVar141 = fVar115;
                                      }
                                      iVar85 = (int)fVar145;
                                      fVar156 = (float)local_4e8._0_4_;
                                      if (fVar116 <= (float)local_4e8._0_4_) {
                                        fVar156 = fVar116;
                                      }
                                      local_4e8._0_4_ = fVar156;
                                      iVar67 = (int)fVar155;
                                      if (iVar85 == iVar67) {
                                        local_468 = ZEXT416((uint)fVar155);
                                        local_438 = ZEXT416((uint)fVar141);
                                        if ((iVar85 < 0) || ((int)(uint)local_420 < iVar85)) {
                                          LogFatalMsg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xbd4,"stbtt__fill_active_edges_new",
                                                  "ImGui ASSERT FAILED: %s","x >= 0 && x < len");
                                        }
                                        lVar96 = (long)iVar85;
                                        *(float *)((long)&scanline->data + lVar96 * 4) =
                                             (((local_468._0_4_ - (float)iVar85) +
                                              (fVar145 - (float)iVar85)) * -0.5 + 1.0) *
                                             ((stbtt__active_edge *)auVar106)->direction *
                                             (fVar156 - (float)local_438._0_4_) +
                                             *(float *)((long)&scanline->data + lVar96 * 4);
                                        fVar138 = (fVar156 - (float)local_438._0_4_) *
                                                  ((stbtt__active_edge *)auVar106)->direction;
                                      }
                                      else {
                                        iVar110 = iVar85;
                                        local_3d8._0_4_ = fVar155;
                                        if (fVar155 < fVar145) {
                                          fVar138 = fVar115 - fVar141;
                                          fVar141 = (fVar115 - fVar156) + fVar116;
                                          local_3e8._0_4_ = -(float)local_3e8._0_4_;
                                          local_3e8._4_4_ = local_3e8._4_4_ ^ 0x80000000;
                                          local_3e8._8_4_ = local_3e8._8_4_ ^ 0x80000000;
                                          local_3e8._12_4_ = local_3e8._12_4_ ^ 0x80000000;
                                          local_4e8._0_4_ = fVar138 + fVar116;
                                          iVar110 = iVar67;
                                          iVar67 = iVar85;
                                          fVar138 = fVar117;
                                          local_3d8._0_4_ = fVar145;
                                          fVar145 = fVar155;
                                        }
                                        iVar85 = iVar110 + 1;
                                        local_474 = ((float)iVar85 - fVar138) *
                                                    (float)local_3e8._0_4_ + fVar115;
                                        fVar138 = ((stbtt__active_edge *)auVar106)->direction;
                                        local_438 = ZEXT416((uint)fVar141);
                                        fVar141 = (local_474 - fVar141) * fVar138;
                                        local_468 = ZEXT416((uint)fVar141);
                                        lVar96 = (long)iVar110;
                                        *(float *)((long)&scanline->data + lVar96 * 4) =
                                             (((fVar145 - (float)iVar110) + 1.0) * -0.5 + 1.0) *
                                             fVar141 + *(float *)((long)&scanline->data + lVar96 * 4
                                                                 );
                                        if (iVar67 - iVar85 != 0 && iVar85 <= iVar67) {
                                          do {
                                            *(float *)((long)&scanline->data + lVar96 * 4 + 4) =
                                                 (float)local_3e8._0_4_ * fVar138 * 0.5 +
                                                 local_468._0_4_ +
                                                 *(float *)((long)&scanline->data + lVar96 * 4 + 4);
                                            local_468._0_4_ =
                                                 local_468._0_4_ + (float)local_3e8._0_4_ * fVar138;
                                            lVar96 = lVar96 + 1;
                                          } while (iVar67 + -1 != (int)lVar96);
                                        }
                                        if (1.01 < ABS(local_468._0_4_)) {
                                          LogFatalMsg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                                  ,0xbfb,"stbtt__fill_active_edges_new",
                                                  "ImGui ASSERT FAILED: %s","fabsf(area) <= 1.01f");
                                        }
                                        lVar96 = (long)iVar67;
                                        *(float *)((long)&scanline->data + lVar96 * 4) =
                                             ((float)local_4e8._0_4_ -
                                             (local_3e8._0_4_ * (float)(iVar67 - iVar85) + local_474
                                             )) * ((((float)local_3d8._0_4_ - (float)iVar67) + 0.0)
                                                   * -0.5 + 1.0) * fVar138 + (float)local_468._0_4_
                                             + *(float *)((long)&scanline->data + lVar96 * 4);
                                        fVar138 = ((float)local_4e8._0_4_ - (float)local_438._0_4_)
                                                  * fVar138;
                                      }
                                      local_338[lVar96] = fVar138 + local_338[lVar96];
                                      goto LAB_001cc759;
                                    }
                                  }
                                  if ((uint)local_420 < 0x7fffffff) {
                                    uVar69 = 0;
                                    do {
                                      fVar141 = (float)(int)uVar69;
                                      _local_4e8 = ZEXT416((uint)fVar141);
                                      uVar108 = uVar69 + 1;
                                      fVar117 = (float)(int)uVar108;
                                      fVar138 = (fVar141 - (float)local_468._0_4_) / local_474 +
                                                fVar115;
                                      local_3e8 = ZEXT416((uint)fVar138);
                                      fVar145 = (fVar117 - (float)local_468._0_4_) / local_474 +
                                                fVar115;
                                      local_3d8 = ZEXT416((uint)fVar145);
                                      if ((fVar141 <= (float)local_468._0_4_) ||
                                         ((float)local_438._0_4_ <= fVar117)) {
                                        fVar155 = fVar115;
                                        if ((fVar141 <= (float)local_438._0_4_) ||
                                           ((float)local_468._0_4_ <= fVar117)) {
                                          fVar145 = (float)local_468._0_4_;
                                          if (((float)local_438._0_4_ <= fVar141 ||
                                               fVar141 <= (float)local_468._0_4_) &&
                                             ((float)local_468._0_4_ <= fVar141 ||
                                              fVar141 <= (float)local_438._0_4_)) {
                                            auVar130 = ZEXT416((uint)fVar115);
                                            fVar141 = (float)local_468._0_4_;
                                            if ((fVar117 < (float)local_438._0_4_ &&
                                                 (float)local_468._0_4_ < fVar117) ||
                                               (auVar130 = ZEXT416((uint)fVar115),
                                               fVar117 < (float)local_468._0_4_ &&
                                               (float)local_438._0_4_ < fVar117)) goto LAB_001cc389;
                                            goto LAB_001cc504;
                                          }
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar69,
                                                     (stbtt__active_edge *)auVar106,
                                                     (float)local_468._0_4_,fVar115,fVar117,fVar145)
                                          ;
                                          fVar115 = (float)local_3d8._0_4_;
                                          fVar138 = (float)local_3e8._0_4_;
                                          fVar145 = fVar117;
                                        }
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar69,
                                                   (stbtt__active_edge *)auVar106,fVar145,fVar115,
                                                   fVar141,fVar138);
                                        auVar130 = local_3e8;
                                        fVar115 = fVar155;
                                      }
                                      else {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar69,
                                                   (stbtt__active_edge *)auVar106,
                                                   (float)local_468._0_4_,fVar115,fVar141,fVar138);
                                        auVar130 = local_3e8;
LAB_001cc389:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar69,
                                                   (stbtt__active_edge *)auVar106,fVar141,
                                                   auVar130._0_4_,fVar117,(float)local_3d8._0_4_);
                                        auVar130 = local_3d8;
                                        fVar141 = fVar117;
                                      }
LAB_001cc504:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar69,
                                                 (stbtt__active_edge *)auVar106,fVar141,
                                                 auVar130._0_4_,local_438._0_4_,fVar116);
                                      uVar69 = uVar108;
                                    } while (local_3f4 != uVar108);
                                  }
                                }
                                else if (fVar141 < local_3f8) {
                                  iVar85 = 0;
                                  if (0.0 <= fVar141) {
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar141,
                                               (stbtt__active_edge *)auVar106,fVar141,fVar115,
                                               fVar141,fVar116);
                                    iVar85 = (int)fVar141 + 1;
                                    fVar141 = local_468._0_4_;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_330,iVar85,(stbtt__active_edge *)auVar106,fVar141
                                             ,fVar115,fVar141,fVar116);
                                }
LAB_001cc759:
                              }
                              uVar69 = (uint)DAT_0024fea0;
                              auVar143._0_12_ = ZEXT812(0x437f0000);
                              auVar143._12_4_ = 0.0;
                              auVar106 = local_470;
                              if ((uint)local_420 < 0x7fffffff) {
                                fVar115 = 0.0;
                                psVar79 = scanline;
                                uVar70 = local_380;
                                lVar96 = local_2f8;
                                do {
                                  fVar115 = fVar115 + *(float *)((long)&psVar79->data +
                                                                local_2f8 * 4);
                                  iVar85 = (int)((float)((uint)(*(float *)&psVar79->data + fVar115)
                                                        & uVar69) * 255.0 + 0.5);
                                  uVar98 = (uchar)iVar85;
                                  if (0xfe < iVar85) {
                                    uVar98 = 0xff;
                                  }
                                  local_2e0[(int)uVar70] = uVar98;
                                  uVar70 = (ulong)((int)uVar70 + 1);
                                  psVar79 = (stbtt__buf *)((long)&psVar79->data + 4);
                                  lVar96 = lVar96 + -1;
                                } while (lVar96 != 0);
                              }
                              for (; auVar106 != (undefined1  [8])0x0;
                                  auVar106 = (undefined1  [8])((stbtt__active_edge *)auVar106)->next
                                  ) {
                                ((stbtt__active_edge *)auVar106)->fx =
                                     ((stbtt__active_edge *)auVar106)->fdx +
                                     ((stbtt__active_edge *)auVar106)->fx;
                              }
                              iVar85 = local_35c + 1;
                              iVar67 = (int)local_378;
                              local_378 = (ulong)(iVar67 + 1);
                              local_380 = (ulong)(uint)((int)local_380 + iVar95);
                              auVar106 = local_470;
                              puVar80 = local_3a0;
                            } while (iVar67 != (uint)local_3c0);
                            while (puVar80 != (undefined8 *)0x0) {
                              puVar14 = (undefined8 *)*puVar80;
                              ImGui::MemFree(puVar80);
                              puVar80 = puVar14;
                            }
                          }
                          if (scanline != local_238) {
                            ImGui::MemFree(scanline);
                          }
                          ImGui::MemFree(local_450);
                          pvVar71 = pvVar111;
                        }
                        ImGui::MemFree(pvVar71);
                        ImGui::MemFree(local_448);
                      }
                    }
                  }
                }
              }
LAB_001ccaa9:
              ImGui::MemFree((void *)CONCAT44(local_400._4_4_,(stbtt_uint32)local_400));
              uVar70 = (ulong)*(ushort *)(local_3b8 + 8);
              uVar84 = *(ushort *)(local_3b8 + 10);
              uVar58 = *(ushort *)(local_3b8 + 4);
              uVar69 = (uint)uVar58;
              uVar59 = *(ushort *)(local_3b8 + 6);
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar108 = 0;
                if (uVar59 == 0) {
                  uVar59 = 0;
                }
                else {
                  uVar69 = (uint)uVar59;
                  puVar78 = local_388 +
                            (long)(int)((uint)uVar84 * iVar95) + (ulong)*(ushort *)(local_3b8 + 8);
                  iVar95 = (uint)uVar58 - (int)(float)local_488;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uStack_4e0;
                  _local_4e8 = auVar55 << 0x40;
                  uVar105 = iVar95 + 1;
                  uVar70 = (ulong)uVar105;
                  do {
                    uVar72 = local_320;
                    memset(local_238,0,local_320);
                    uVar88 = uVar105;
                    switch((int)uVar72) {
                    case 2:
                      if (iVar95 < 0) {
LAB_001cccec:
                        uVar93 = 0;
                        uVar88 = 0;
                      }
                      else {
                        uVar72 = 0;
                        uVar93 = 0;
                        do {
                          bVar113 = puVar78[uVar72];
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 2 & 7)) =
                               bVar113;
                          uVar87 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                          uVar93 = (ulong)uVar87;
                          puVar78[uVar72] = (uchar)(uVar87 >> 1);
                          uVar72 = uVar72 + 1;
                        } while (uVar70 != uVar72);
                      }
                      break;
                    case 3:
                      if (iVar95 < 0) goto LAB_001cccec;
                      uVar72 = 0;
                      uVar93 = 0;
                      do {
                        bVar113 = puVar78[uVar72];
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 3 & 7)) =
                             bVar113;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar113 - (uint)bVar6));
                        puVar78[uVar72] = (uchar)(uVar93 / 3);
                        uVar72 = uVar72 + 1;
                      } while (uVar70 != uVar72);
                      break;
                    case 4:
                      if (iVar95 < 0) goto LAB_001cccec;
                      uVar72 = 0;
                      uVar93 = 0;
                      do {
                        bVar113 = puVar78[uVar72];
                        uVar102 = (ulong)((uint)uVar72 & 7);
                        bVar6 = *(byte *)((long)&local_238[0].data + uVar102);
                        *(byte *)((long)&local_238[0].data + (uVar102 ^ 4)) = bVar113;
                        uVar87 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                        uVar93 = (ulong)uVar87;
                        puVar78[uVar72] = (uchar)(uVar87 >> 2);
                        uVar72 = uVar72 + 1;
                      } while (uVar70 != uVar72);
                      break;
                    case 5:
                      if (iVar95 < 0) goto LAB_001cccec;
                      uVar72 = 0;
                      uVar93 = 0;
                      do {
                        bVar113 = puVar78[uVar72];
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 5 & 7)) =
                             bVar113;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar113 - (uint)bVar6));
                        puVar78[uVar72] = (uchar)(uVar93 / 5);
                        uVar72 = uVar72 + 1;
                      } while (uVar70 != uVar72);
                      break;
                    default:
                      if (iVar95 < 0) goto LAB_001cccec;
                      uVar72 = 0;
                      uVar93 = 0;
                      do {
                        bVar113 = puVar78[uVar72];
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data +
                                 (ulong)((int)(float)local_488 + (uint)uVar72 & 7)) = bVar113;
                        uVar87 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                        uVar93 = (ulong)uVar87;
                        puVar78[uVar72] = (uchar)(uVar87 / (uint)(float)local_488);
                        uVar72 = uVar72 + 1;
                      } while (uVar70 != uVar72);
                    }
                    if ((int)uVar88 < (int)(uint)uVar58) {
                      uVar72 = (ulong)uVar88;
                      do {
                        if (puVar78[uVar72] != '\0') {
                          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                      ,0xf41,"stbtt__h_prefilter","ImGui ASSERT FAILED: %s",
                                      "pixels[i] == 0");
                        }
                        uVar88 = (int)uVar93 -
                                 (uint)*(byte *)((long)&local_238[0].data +
                                                (ulong)((uint)uVar72 & 7));
                        uVar93 = (ulong)uVar88;
                        puVar78[uVar72] = (uchar)(uVar88 / (uint)(float)local_488);
                        uVar72 = uVar72 + 1;
                      } while ((int)uVar72 < (int)(uint)uVar58);
                    }
                    puVar78 = puVar78 + local_498._0_8_;
                    uVar108 = uVar108 + 1;
                  } while (uVar108 != uVar69);
                  uVar70 = (ulong)*(ushort *)(local_3b8 + 8);
                  uVar84 = *(ushort *)(local_3b8 + 10);
                  uVar69 = (uint)*(ushort *)(local_3b8 + 4);
                  uVar59 = *(ushort *)(local_3b8 + 6);
                  iVar95 = local_478;
                }
              }
              sVar114 = (short)uVar70;
              if (1 < (byte)local_328) {
                local_238[0].data = (uchar *)0x0;
                if ((short)uVar69 == 0) {
                  uVar69 = 0;
                }
                else {
                  auVar48._12_4_ = 0;
                  auVar48._0_12_ = stack0xfffffffffffffb1c;
                  _local_4e8 = auVar48 << 0x20;
                  pbVar112 = local_388 + (long)(int)((uint)uVar84 * iVar95) + uVar70;
                  iVar95 = uVar59 - uVar66;
                  uVar108 = iVar95 + 1;
                  uVar70 = (ulong)uVar108;
                  do {
                    uVar72 = local_328;
                    memset(local_238,0,local_328);
                    uVar105 = uVar108;
                    switch((int)uVar72) {
                    case 2:
                      if (iVar95 < 0) {
LAB_001ccfc5:
                        uVar93 = 0;
                        uVar105 = 0;
                      }
                      else {
                        uVar72 = 0;
                        uVar93 = 0;
                        pbVar99 = pbVar112;
                        do {
                          bVar113 = *pbVar99;
                          bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 2 & 7)) =
                               bVar113;
                          uVar88 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                          uVar93 = (ulong)uVar88;
                          *pbVar99 = (byte)(uVar88 >> 1);
                          uVar72 = uVar72 + 1;
                          pbVar99 = pbVar99 + local_498._0_8_;
                        } while (uVar70 != uVar72);
                      }
                      break;
                    case 3:
                      if (iVar95 < 0) goto LAB_001ccfc5;
                      uVar72 = 0;
                      uVar93 = 0;
                      pbVar99 = pbVar112;
                      do {
                        bVar113 = *pbVar99;
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 3 & 7)) =
                             bVar113;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar113 - (uint)bVar6));
                        *pbVar99 = (byte)(uVar93 / 3);
                        uVar72 = uVar72 + 1;
                        pbVar99 = pbVar99 + local_498._0_8_;
                      } while (uVar70 != uVar72);
                      break;
                    case 4:
                      if (iVar95 < 0) goto LAB_001ccfc5;
                      uVar72 = 0;
                      uVar93 = 0;
                      pbVar99 = pbVar112;
                      do {
                        bVar113 = *pbVar99;
                        uVar102 = (ulong)((uint)uVar72 & 7);
                        bVar6 = *(byte *)((long)&local_238[0].data + uVar102);
                        *(byte *)((long)&local_238[0].data + (uVar102 ^ 4)) = bVar113;
                        uVar88 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                        uVar93 = (ulong)uVar88;
                        *pbVar99 = (byte)(uVar88 >> 2);
                        uVar72 = uVar72 + 1;
                        pbVar99 = pbVar99 + local_498._0_8_;
                      } while (uVar70 != uVar72);
                      break;
                    case 5:
                      if (iVar95 < 0) goto LAB_001ccfc5;
                      uVar72 = 0;
                      uVar93 = 0;
                      pbVar99 = pbVar112;
                      do {
                        bVar113 = *pbVar99;
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 + 5 & 7)) =
                             bVar113;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar113 - (uint)bVar6));
                        *pbVar99 = (byte)(uVar93 / 5);
                        uVar72 = uVar72 + 1;
                        pbVar99 = pbVar99 + local_498._0_8_;
                      } while (uVar70 != uVar72);
                      break;
                    default:
                      if (iVar95 < 0) goto LAB_001ccfc5;
                      uVar72 = 0;
                      uVar93 = 0;
                      pbVar99 = pbVar112;
                      do {
                        bVar113 = *pbVar99;
                        bVar6 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar72 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)(uVar66 + (uint)uVar72 & 7)) =
                             bVar113;
                        uVar88 = (int)uVar93 + ((uint)bVar113 - (uint)bVar6);
                        uVar93 = (ulong)uVar88;
                        *pbVar99 = (byte)(uVar88 / uVar123);
                        uVar72 = uVar72 + 1;
                        pbVar99 = pbVar99 + local_498._0_8_;
                      } while (uVar70 != uVar72);
                    }
                    if ((int)uVar105 < (int)(uint)uVar59) {
                      lVar96 = (long)(int)uVar105;
                      pbVar99 = pbVar112 + local_498._0_8_ * lVar96;
                      do {
                        if (*pbVar99 != 0) {
                          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                                      ,0xf7f,"stbtt__v_prefilter","ImGui ASSERT FAILED: %s",
                                      "pixels[i*stride_in_bytes] == 0");
                        }
                        uVar105 = (int)uVar93 -
                                  (uint)*(byte *)((long)&local_238[0].data +
                                                 (ulong)((uint)lVar96 & 7));
                        uVar93 = (ulong)uVar105;
                        *pbVar99 = (byte)(uVar105 / uVar66);
                        lVar96 = lVar96 + 1;
                        pbVar99 = pbVar99 + local_498._0_8_;
                      } while ((uint)uVar59 != (uint)lVar96);
                    }
                    pbVar112 = pbVar112 + 1;
                    uVar105 = local_4e8._0_4_ + 1;
                    local_4e8._0_4_ = uVar105;
                  } while (uVar105 != uVar69);
                  sVar114 = *(short *)(local_3b8 + 8);
                  uVar84 = *(ushort *)(local_3b8 + 10);
                  uVar69 = (uint)*(ushort *)(local_3b8 + 4);
                  uVar59 = *(ushort *)(local_3b8 + 6);
                  iVar95 = local_478;
                }
              }
              *local_2d0 = sVar114;
              local_2d0[1] = uVar84;
              local_2d0[2] = sVar114 + (short)uVar69;
              local_2d0[3] = uVar59 + uVar84;
              *(float *)(local_2d0 + 8) =
                   (float)(int)(short)((short)(local_354 << 8) + (short)local_358) *
                   (float)local_318._0_4_;
              *(ulong *)(local_2d0 + 4) =
                   CONCAT44((float)local_34c * local_268._4_4_ + local_258._4_4_,
                            (float)local_348 * local_268._0_4_ + local_258._0_4_);
              *(float *)(local_2d0 + 10) =
                   (float)(int)(uVar69 + local_348) * local_268._0_4_ + local_258._0_4_;
              *(float *)(local_2d0 + 0xc) =
                   (float)(int)((uint)uVar59 + local_34c) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar85 = local_3f0[1].fontstart;
              lVar76 = local_2d8;
              lVar74 = local_2c8;
              psVar97 = local_3f0;
              lVar96 = local_370;
            }
            lVar74 = lVar74 + 1;
          } while (lVar74 < iVar85);
        }
        fVar115 = local_300[lVar96].RasterizerMultiply;
        if ((fVar115 != 1.0) || (NAN(fVar115))) {
          lVar74 = 0;
          auVar133 = _DAT_00273b00;
          auVar139 = _DAT_0027b3f0;
          auVar144 = _DAT_0027b3e0;
          auVar147 = _DAT_0027b3d0;
          do {
            auVar130 = auVar139 & _DAT_0027b400 | _DAT_0027b410;
            uVar69 = auVar139._4_4_;
            uVar66 = auVar139._8_4_;
            uVar108 = auVar139._12_4_;
            auVar164 = auVar133 & _DAT_0027b400 | _DAT_0027b410;
            uVar105 = auVar133._4_4_;
            uVar88 = auVar133._8_4_;
            uVar87 = auVar133._12_4_;
            auVar174 = auVar147 & _DAT_0027b400 | _DAT_0027b410;
            uVar167 = auVar147._4_4_;
            uVar169 = auVar147._8_4_;
            uVar171 = auVar147._12_4_;
            auVar118 = auVar144 & _DAT_0027b400 | _DAT_0027b410;
            uVar178 = auVar144._4_4_;
            uVar180 = auVar144._8_4_;
            uVar182 = auVar144._12_4_;
            fVar173 = (((float)(auVar144._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar118._0_4_) * fVar115;
            fVar179 = (((float)(uVar178 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar118._4_4_) *
                      fVar115;
            fVar181 = (((float)(uVar180 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar118._8_4_) *
                      fVar115;
            fVar183 = (((float)(uVar182 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar118._12_4_) *
                      fVar115;
            fVar158 = (((float)(auVar147._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar174._0_4_) * fVar115;
            fVar168 = (((float)(uVar167 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar174._4_4_) *
                      fVar115;
            fVar170 = (((float)(uVar169 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar174._8_4_) *
                      fVar115;
            fVar172 = (((float)(uVar171 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar174._12_4_) *
                      fVar115;
            fVar117 = (((float)(auVar133._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar164._0_4_) * fVar115;
            fVar155 = (((float)(uVar105 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar164._4_4_) *
                      fVar115;
            fVar156 = (((float)(uVar88 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar164._8_4_) *
                      fVar115;
            fVar157 = (((float)(uVar87 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar164._12_4_) *
                      fVar115;
            fVar116 = (((float)(auVar139._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar130._0_4_) * fVar115;
            fVar141 = (((float)(uVar69 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar130._4_4_) *
                      fVar115;
            fVar138 = (((float)(uVar66 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar130._8_4_) *
                      fVar115;
            fVar145 = (((float)(uVar108 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar130._12_4_) *
                      fVar115;
            auVar151._0_4_ = (int)fVar116;
            auVar151._4_4_ = (int)fVar141;
            auVar151._8_4_ = (int)fVar138;
            auVar151._12_4_ = (int)fVar145;
            auVar194._0_4_ = auVar151._0_4_ >> 0x1f;
            auVar194._4_4_ = auVar151._4_4_ >> 0x1f;
            auVar194._8_4_ = auVar151._8_4_ >> 0x1f;
            auVar194._12_4_ = auVar151._12_4_ >> 0x1f;
            auVar150._0_4_ = (int)(fVar116 - 2.1474836e+09);
            auVar150._4_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar150._8_4_ = (int)(fVar138 - 2.1474836e+09);
            auVar150._12_4_ = (int)(fVar145 - 2.1474836e+09);
            auVar151 = auVar150 & auVar194 | auVar151;
            auVar154._0_4_ = (int)fVar117;
            auVar154._4_4_ = (int)fVar155;
            auVar154._8_4_ = (int)fVar156;
            auVar154._12_4_ = (int)fVar157;
            auVar195._0_4_ = auVar154._0_4_ >> 0x1f;
            auVar195._4_4_ = auVar154._4_4_ >> 0x1f;
            auVar195._8_4_ = auVar154._8_4_ >> 0x1f;
            auVar195._12_4_ = auVar154._12_4_ >> 0x1f;
            auVar153._0_4_ = (int)(fVar117 - 2.1474836e+09);
            auVar153._4_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar153._8_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar153._12_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar154 = auVar153 & auVar195 | auVar154;
            auVar190._0_4_ = (int)fVar158;
            auVar190._4_4_ = (int)fVar168;
            auVar190._8_4_ = (int)fVar170;
            auVar190._12_4_ = (int)fVar172;
            auVar198._0_4_ = auVar190._0_4_ >> 0x1f;
            auVar198._4_4_ = auVar190._4_4_ >> 0x1f;
            auVar198._8_4_ = auVar190._8_4_ >> 0x1f;
            auVar198._12_4_ = auVar190._12_4_ >> 0x1f;
            auVar189._0_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar189._4_4_ = (int)(fVar168 - 2.1474836e+09);
            auVar189._8_4_ = (int)(fVar170 - 2.1474836e+09);
            auVar189._12_4_ = (int)(fVar172 - 2.1474836e+09);
            auVar190 = auVar189 & auVar198 | auVar190;
            auVar176._0_4_ = (int)fVar173;
            auVar176._4_4_ = (int)fVar179;
            auVar176._8_4_ = (int)fVar181;
            auVar176._12_4_ = (int)fVar183;
            auVar196._0_4_ = auVar176._0_4_ >> 0x1f;
            auVar196._4_4_ = auVar176._4_4_ >> 0x1f;
            auVar196._8_4_ = auVar176._8_4_ >> 0x1f;
            auVar196._12_4_ = auVar176._12_4_ >> 0x1f;
            auVar175._0_4_ = (int)(fVar173 - 2.1474836e+09);
            auVar175._4_4_ = (int)(fVar179 - 2.1474836e+09);
            auVar175._8_4_ = (int)(fVar181 - 2.1474836e+09);
            auVar175._12_4_ = (int)(fVar183 - 2.1474836e+09);
            auVar176 = auVar175 & auVar196 | auVar176;
            auVar130 = auVar176 ^ _DAT_00246490;
            auVar165._0_4_ = -(uint)(auVar130._0_4_ < -0x7fffff01);
            auVar165._4_4_ = -(uint)(auVar130._4_4_ < -0x7fffff01);
            auVar165._8_4_ = -(uint)(auVar130._8_4_ < -0x7fffff01);
            auVar165._12_4_ = -(uint)(auVar130._12_4_ < -0x7fffff01);
            auVar130 = ~auVar165 & _DAT_0027b460 | auVar176 & auVar165;
            auVar164 = auVar190 ^ _DAT_00246490;
            auVar197._0_4_ = -(uint)(auVar164._0_4_ < -0x7fffff01);
            auVar197._4_4_ = -(uint)(auVar164._4_4_ < -0x7fffff01);
            auVar197._8_4_ = -(uint)(auVar164._8_4_ < -0x7fffff01);
            auVar197._12_4_ = -(uint)(auVar164._12_4_ < -0x7fffff01);
            auVar164 = ~auVar197 & _DAT_0027b460 | auVar190 & auVar197;
            sVar114 = auVar130._0_2_;
            cVar17 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[0] - (0xff < sVar114);
            sVar114 = auVar130._2_2_;
            sVar124 = CONCAT11((0 < sVar114) * (sVar114 < 0x100) * auVar130[2] - (0xff < sVar114),
                               cVar17);
            sVar114 = auVar130._4_2_;
            cVar121 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[4] - (0xff < sVar114);
            sVar114 = auVar130._6_2_;
            uVar159 = CONCAT13((0 < sVar114) * (sVar114 < 0x100) * auVar130[6] - (0xff < sVar114),
                               CONCAT12(cVar121,sVar124));
            sVar114 = auVar130._8_2_;
            cVar18 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[8] - (0xff < sVar114);
            sVar114 = auVar130._10_2_;
            uVar160 = CONCAT15((0 < sVar114) * (sVar114 < 0x100) * auVar130[10] - (0xff < sVar114),
                               CONCAT14(cVar18,uVar159));
            sVar114 = auVar130._12_2_;
            cVar19 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[0xc] - (0xff < sVar114);
            sVar114 = auVar130._14_2_;
            uVar161 = CONCAT17((0 < sVar114) * (sVar114 < 0x100) * auVar130[0xe] - (0xff < sVar114),
                               CONCAT16(cVar19,uVar160));
            sVar114 = auVar164._0_2_;
            cVar20 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[0] - (0xff < sVar114);
            sVar114 = auVar164._2_2_;
            auVar162._0_10_ =
                 CONCAT19((0 < sVar114) * (sVar114 < 0x100) * auVar164[2] - (0xff < sVar114),
                          CONCAT18(cVar20,uVar161));
            sVar114 = auVar164._4_2_;
            cVar21 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[4] - (0xff < sVar114);
            auVar162[10] = cVar21;
            sVar114 = auVar164._6_2_;
            auVar162[0xb] = (0 < sVar114) * (sVar114 < 0x100) * auVar164[6] - (0xff < sVar114);
            sVar114 = auVar164._8_2_;
            cVar125 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[8] - (0xff < sVar114);
            auVar163[0xc] = cVar125;
            auVar163._0_12_ = auVar162;
            sVar114 = auVar164._10_2_;
            auVar163[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar164[10] - (0xff < sVar114);
            sVar114 = auVar164._12_2_;
            cVar122 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[0xc] - (0xff < sVar114);
            auVar166[0xe] = cVar122;
            auVar166._0_14_ = auVar163;
            sVar114 = auVar164._14_2_;
            auVar166[0xf] = (0 < sVar114) * (sVar114 < 0x100) * auVar164[0xe] - (0xff < sVar114);
            auVar130 = auVar154 ^ _DAT_00246490;
            auVar191._0_4_ = -(uint)(auVar130._0_4_ < -0x7fffff01);
            auVar191._4_4_ = -(uint)(auVar130._4_4_ < -0x7fffff01);
            auVar191._8_4_ = -(uint)(auVar130._8_4_ < -0x7fffff01);
            auVar191._12_4_ = -(uint)(auVar130._12_4_ < -0x7fffff01);
            auVar164 = ~auVar191 & _DAT_0027b460 | auVar154 & auVar191;
            auVar130 = auVar151 ^ _DAT_00246490;
            auVar177._0_4_ = -(uint)(auVar130._0_4_ < -0x7fffff01);
            auVar177._4_4_ = -(uint)(auVar130._4_4_ < -0x7fffff01);
            auVar177._8_4_ = -(uint)(auVar130._8_4_ < -0x7fffff01);
            auVar177._12_4_ = -(uint)(auVar130._12_4_ < -0x7fffff01);
            auVar130 = ~auVar177 & _DAT_0027b460 | auVar151 & auVar177;
            sVar114 = auVar164._0_2_;
            cVar22 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[0] - (0xff < sVar114);
            sVar114 = auVar164._2_2_;
            sVar126 = CONCAT11((0 < sVar114) * (sVar114 < 0x100) * auVar164[2] - (0xff < sVar114),
                               cVar22);
            sVar114 = auVar164._4_2_;
            cVar23 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[4] - (0xff < sVar114);
            sVar114 = auVar164._6_2_;
            uVar184 = CONCAT13((0 < sVar114) * (sVar114 < 0x100) * auVar164[6] - (0xff < sVar114),
                               CONCAT12(cVar23,sVar126));
            sVar114 = auVar164._8_2_;
            cVar24 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[8] - (0xff < sVar114);
            sVar114 = auVar164._10_2_;
            uVar185 = CONCAT15((0 < sVar114) * (sVar114 < 0x100) * auVar164[10] - (0xff < sVar114),
                               CONCAT14(cVar24,uVar184));
            sVar114 = auVar164._12_2_;
            cVar25 = (0 < sVar114) * (sVar114 < 0x100) * auVar164[0xc] - (0xff < sVar114);
            sVar114 = auVar164._14_2_;
            uVar186 = CONCAT17((0 < sVar114) * (sVar114 < 0x100) * auVar164[0xe] - (0xff < sVar114),
                               CONCAT16(cVar25,uVar185));
            sVar114 = auVar130._0_2_;
            cVar26 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[0] - (0xff < sVar114);
            sVar114 = auVar130._2_2_;
            auVar187._0_10_ =
                 CONCAT19((0 < sVar114) * (sVar114 < 0x100) * auVar130[2] - (0xff < sVar114),
                          CONCAT18(cVar26,uVar186));
            sVar114 = auVar130._4_2_;
            cVar27 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[4] - (0xff < sVar114);
            auVar187[10] = cVar27;
            sVar114 = auVar130._6_2_;
            auVar187[0xb] = (0 < sVar114) * (sVar114 < 0x100) * auVar130[6] - (0xff < sVar114);
            sVar114 = auVar130._8_2_;
            cVar28 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[8] - (0xff < sVar114);
            auVar188[0xc] = cVar28;
            auVar188._0_12_ = auVar187;
            sVar114 = auVar130._10_2_;
            auVar188[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar130[10] - (0xff < sVar114);
            sVar114 = auVar130._12_2_;
            cVar29 = (0 < sVar114) * (sVar114 < 0x100) * auVar130[0xc] - (0xff < sVar114);
            auVar192[0xe] = cVar29;
            auVar192._0_14_ = auVar188;
            sVar114 = auVar130._14_2_;
            auVar192[0xf] = (0 < sVar114) * (sVar114 < 0x100) * auVar130[0xe] - (0xff < sVar114);
            sVar114 = (short)((uint)uVar184 >> 0x10);
            auVar193[1] = (0 < sVar114) * (sVar114 < 0x100) * cVar23 - (0xff < sVar114);
            auVar193[0] = (0 < sVar126) * (sVar126 < 0x100) * cVar22 - (0xff < sVar126);
            sVar114 = (short)((uint6)uVar185 >> 0x20);
            auVar193[2] = (0 < sVar114) * (sVar114 < 0x100) * cVar24 - (0xff < sVar114);
            sVar114 = (short)((ulong)uVar186 >> 0x30);
            auVar193[3] = (0 < sVar114) * (sVar114 < 0x100) * cVar25 - (0xff < sVar114);
            sVar114 = (short)((unkuint10)auVar187._0_10_ >> 0x40);
            auVar193[4] = (0 < sVar114) * (sVar114 < 0x100) * cVar26 - (0xff < sVar114);
            sVar114 = auVar187._10_2_;
            auVar193[5] = (0 < sVar114) * (sVar114 < 0x100) * cVar27 - (0xff < sVar114);
            sVar114 = auVar188._12_2_;
            auVar193[6] = (0 < sVar114) * (sVar114 < 0x100) * cVar28 - (0xff < sVar114);
            sVar114 = auVar192._14_2_;
            auVar193[7] = (0 < sVar114) * (sVar114 < 0x100) * cVar29 - (0xff < sVar114);
            auVar193[8] = (0 < sVar124) * (sVar124 < 0x100) * cVar17 - (0xff < sVar124);
            sVar114 = (short)((uint)uVar159 >> 0x10);
            auVar193[9] = (0 < sVar114) * (sVar114 < 0x100) * cVar121 - (0xff < sVar114);
            sVar114 = (short)((uint6)uVar160 >> 0x20);
            auVar193[10] = (0 < sVar114) * (sVar114 < 0x100) * cVar18 - (0xff < sVar114);
            sVar114 = (short)((ulong)uVar161 >> 0x30);
            auVar193[0xb] = (0 < sVar114) * (sVar114 < 0x100) * cVar19 - (0xff < sVar114);
            sVar114 = (short)((unkuint10)auVar162._0_10_ >> 0x40);
            auVar193[0xc] = (0 < sVar114) * (sVar114 < 0x100) * cVar20 - (0xff < sVar114);
            sVar114 = auVar162._10_2_;
            auVar193[0xd] = (0 < sVar114) * (sVar114 < 0x100) * cVar21 - (0xff < sVar114);
            sVar114 = auVar163._12_2_;
            auVar193[0xe] = (0 < sVar114) * (sVar114 < 0x100) * cVar125 - (0xff < sVar114);
            sVar114 = auVar166._14_2_;
            auVar193[0xf] = (0 < sVar114) * (sVar114 < 0x100) * cVar122 - (0xff < sVar114);
            *(undefined1 (*) [16])((long)&local_238[0].data + lVar74) = auVar193;
            lVar74 = lVar74 + 0x10;
            auVar133._0_4_ = auVar133._0_4_ + 0x10;
            auVar133._4_4_ = uVar105 + 0x10;
            auVar133._8_4_ = uVar88 + 0x10;
            auVar133._12_4_ = uVar87 + 0x10;
            auVar139._0_4_ = auVar139._0_4_ + 0x10;
            auVar139._4_4_ = uVar69 + 0x10;
            auVar139._8_4_ = uVar66 + 0x10;
            auVar139._12_4_ = uVar108 + 0x10;
            auVar144._0_4_ = auVar144._0_4_ + 0x10;
            auVar144._4_4_ = uVar178 + 0x10;
            auVar144._8_4_ = uVar180 + 0x10;
            auVar144._12_4_ = uVar182 + 0x10;
            auVar147._0_4_ = auVar147._0_4_ + 0x10;
            auVar147._4_4_ = uVar167 + 0x10;
            auVar147._8_4_ = uVar169 + 0x10;
            auVar147._12_4_ = uVar171 + 0x10;
          } while (lVar74 != 0x100);
          iVar85 = psVar97[1].cff.cursor;
          if (0 < iVar85) {
            lVar86._0_4_ = psVar97[1].hmtx;
            lVar86._4_4_ = psVar97[1].kern;
            iVar67 = 0;
            do {
              if ((*(int *)(lVar86 + 0xc) != 0) && (*(ushort *)(lVar86 + 6) != 0)) {
                iVar85 = atlas->TexWidth;
                uVar58 = *(ushort *)(lVar86 + 4);
                puVar78 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar86 + 10) * (long)iVar85 +
                          (ulong)*(ushort *)(lVar86 + 8);
                uVar69 = (uint)*(ushort *)(lVar86 + 6);
                do {
                  if ((ulong)uVar58 != 0) {
                    uVar70 = 0;
                    do {
                      puVar78[uVar70] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar78[uVar70]);
                      uVar70 = uVar70 + 1;
                    } while (uVar58 != uVar70);
                  }
                  puVar78 = puVar78 + iVar85;
                  bVar57 = 1 < (int)uVar69;
                  uVar69 = uVar69 - 1;
                } while (bVar57);
                iVar85 = psVar97[1].cff.cursor;
              }
              iVar67 = iVar67 + 1;
              lVar86 = lVar86 + 0x10;
            } while (iVar67 < iVar85);
          }
        }
        psVar97[1].hmtx = 0;
        psVar97[1].kern = 0;
      }
      lVar96 = lVar96 + 1;
    } while (lVar96 != lVar83);
  }
  ImGui::MemFree(local_458);
  ImGui::MemFree(local_340);
  pvVar71 = pvStack_410;
  if (pvStack_410 != (void *)0x0) {
    auVar49._8_8_ = 0;
    auVar49._0_8_ = pvStack_410;
    _local_418 = (stbtt__buf)(auVar49 << 0x40);
    ImGui::MemFree(pvVar71);
    pvStack_410._0_4_ = 0;
    pvStack_410._4_4_ = 0;
  }
  if (0 < (int)uVar9) {
    sVar128 = DAT_0027b3c0._6_2_;
    sVar126 = DAT_0027b3c0._4_2_;
    sVar124 = DAT_0027b3c0._2_2_;
    sVar114 = (short)DAT_0027b3c0;
    lVar96 = 0;
    do {
      lVar74 = lVar96 * 0x110;
      if (*(int *)((long)pvVar200 + lVar74 + 0xe8) != 0) {
        pvVar111 = pvVar200;
        pvVar71 = local_488;
        if ((atlas->ConfigData).Size <= lVar96) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pvVar111 = pvVar200;
          pvVar71 = local_488;
        }
        local_488._4_4_ = (float)((ulong)pvVar71 >> 0x20);
        pIVar15 = (atlas->ConfigData).Data;
        pIVar13 = pIVar15 + lVar96;
        pIVar11 = pIVar15[lVar96].DstFont;
        pvVar200 = pvVar111;
        if (pIVar15[lVar96].MergeMode == true) {
          auVar130 = ZEXT416((uint)pIVar11->Ascent);
          local_488 = pvVar71;
        }
        else {
          local_498 = ZEXT416((uint)pIVar15[lVar96].SizePixels);
          lVar76 = *(long *)((long)pvVar111 + lVar74 + 8);
          lVar86 = (long)*(int *)((long)pvVar111 + lVar74 + 0x24);
          local_488._0_4_ = (float)(uint)*(byte *)(lVar76 + 4 + lVar86);
          bVar113 = *(byte *)(lVar76 + 5 + lVar86);
          bVar6 = *(byte *)(lVar76 + 7 + lVar86);
          bVar7 = *(byte *)(lVar76 + 6 + lVar86);
          ImFont::ClearOutputData(pIVar11);
          iVar95 = (uint)bVar7 * 0x100 + (int)(float)local_488;
          auVar37._1_9_ = (unkuint9)(byte)((uint)iVar95 >> 0x18) << 8;
          auVar37[0] = (char)((uint)iVar95 >> 0x10);
          auVar37._10_6_ = 0;
          auVar53._1_12_ = SUB1612(auVar37 << 0x28,4);
          auVar53[0] = (char)((uint)iVar95 >> 8);
          auVar53[0xd] = 0;
          auVar54._1_14_ = auVar53 << 8;
          auVar54[0] = (char)iVar95;
          auVar54[0xf] = 0;
          auVar130 = ZEXT416((uint)bVar113 | (uint)bVar6 << 0x10) | auVar54 << 8;
          sVar60 = auVar130._0_2_;
          sVar30 = auVar130._2_2_;
          auVar134._0_4_ = (float)((int)sVar60 - (int)sVar30);
          fVar141 = (float)local_498._0_4_ / auVar134._0_4_;
          sVar129 = auVar130._6_2_;
          auVar137._0_14_ = ZEXT414((uint)auVar134._0_4_);
          auVar137._14_2_ = sVar129;
          sVar127 = auVar130._4_2_;
          auVar136._12_4_ = auVar137._12_4_;
          auVar136._4_6_ = 0;
          auVar136._0_4_ = auVar134._0_4_;
          auVar136._10_2_ = sVar127;
          auVar135._10_6_ = auVar136._10_6_;
          auVar135._4_6_ = 0;
          auVar135._0_4_ = auVar134._0_4_;
          auVar134._8_8_ = auVar135._8_8_;
          auVar134._6_2_ = sVar30;
          auVar134._4_2_ = (short)((uint)auVar134._0_4_ >> 0x10);
          auVar140._0_2_ = -(ushort)(sVar60 < sVar114);
          auVar140._2_2_ = -(ushort)(sVar60 < sVar114);
          auVar140._4_2_ = -(ushort)(sVar30 < sVar124);
          auVar140._6_2_ = -(ushort)(sVar30 < sVar124);
          auVar140._8_2_ = -(ushort)(sVar127 < sVar126);
          auVar140._10_2_ = -(ushort)(sVar127 < sVar126);
          auVar140._12_2_ = -(ushort)(sVar129 < sVar128);
          auVar140._14_2_ = -(ushort)(sVar129 < sVar128);
          auVar130 = auVar140 & _DAT_0027b480 | ~auVar140 & _DAT_0024a360;
          fVar115 = (float)(int)(fVar141 * (float)(int)sVar60 + auVar130._0_4_);
          fVar116 = (float)(int)(fVar141 * (float)(auVar134._4_4_ >> 0x10) + auVar130._4_4_);
          auVar130 = CONCAT412((float)(int)(fVar141 * (float)(auVar136._12_4_ >> 0x10) +
                                           auVar130._12_4_),
                               CONCAT48((float)(int)(fVar141 * (float)(auVar135._8_4_ >> 0x10) +
                                                    auVar130._8_4_),CONCAT44(fVar116,fVar115)));
          pIVar11->FontSize = pIVar13->SizePixels;
          pIVar11->ConfigData = pIVar13;
          pIVar11->ContainerAtlas = atlas;
          pIVar11->Ascent = fVar115;
          pIVar11->Descent = fVar116;
        }
        pIVar11->ConfigDataCount = pIVar11->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar111 + lVar74 + 0xe8)) {
          local_498._0_4_ = (pIVar13->GlyphOffset).x;
          local_488._4_4_ = (float)(int)auVar130._4_4_;
          fStack_480 = (float)(int)auVar130._8_4_;
          fStack_47c = (float)(int)auVar130._12_4_;
          local_488._0_4_ = (float)(int)(auVar130._0_4_ + 0.5) + (pIVar13->GlyphOffset).y;
          lVar86 = 0;
          lVar76 = 0;
          do {
            if (*(int *)((long)pvVar111 + lVar74 + 0x100) <= lVar76) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            lVar16 = *(long *)((long)pvVar111 + lVar74 + 0xd0);
            fVar115 = *(float *)(lVar16 + 0x10 + lVar86);
            fVar116 = pIVar13->GlyphMaxAdvanceX;
            if (fVar115 <= pIVar13->GlyphMaxAdvanceX) {
              fVar116 = fVar115;
            }
            uVar69 = -(uint)(fVar115 < pIVar13->GlyphMinAdvanceX);
            fVar116 = (float)(uVar69 & (uint)pIVar13->GlyphMinAdvanceX | ~uVar69 & (uint)fVar116);
            if ((fVar115 != fVar116) ||
               (fVar141 = (float)local_498._0_4_, NAN(fVar115) || NAN(fVar116))) {
              fVar141 = (fVar116 - fVar115) * 0.5;
              if (pIVar13->PixelSnapH != false) {
                fVar141 = (float)(int)fVar141;
              }
              fVar141 = fVar141 + (float)local_498._0_4_;
            }
            fVar138 = 1.0 / (float)atlas->TexHeight;
            fVar115 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar11,(ImWchar)*(undefined4 *)
                                               (*(long *)((long)pvVar111 + lVar74 + 0x108) +
                                               lVar76 * 4),
                             *(float *)(lVar16 + 8 + lVar86) + 0.0 + fVar141,
                             *(float *)(lVar16 + 0xc + lVar86) + 0.0 + (float)local_488,
                             *(float *)(lVar16 + 0x14 + lVar86) + 0.0 + fVar141,
                             *(float *)(lVar16 + 0x18 + lVar86) + 0.0 + (float)local_488,
                             (float)*(ushort *)(lVar16 + lVar86) * fVar115,
                             (float)*(ushort *)(lVar16 + 2 + lVar86) * fVar138,
                             (float)*(ushort *)(lVar16 + 4 + lVar86) * fVar115,
                             (float)*(ushort *)(lVar16 + 6 + lVar86) * fVar138,fVar116);
            lVar76 = lVar76 + 1;
            lVar86 = lVar86 + 0x1c;
          } while (lVar76 < *(int *)((long)pvVar111 + lVar74 + 0xe8));
        }
      }
      lVar96 = lVar96 + 1;
    } while (lVar96 != lVar83);
    if (0 < (int)uVar9) {
      sVar109 = 0;
      do {
        pvVar71 = *(void **)((long)pvVar200 + sVar109 + 0x108);
        if (pvVar71 != (void *)0x0) {
          ImGui::MemFree(pvVar71);
        }
        pvVar71 = *(void **)((long)pvVar200 + sVar109 + 0xf8);
        if (pvVar71 != (void *)0x0) {
          ImGui::MemFree(pvVar71);
        }
        sVar109 = sVar109 + 0x110;
      } while (local_308 != sVar109);
    }
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_390 != (void *)0x0) {
    ImGui::MemFree(pvStack_390);
  }
  bVar57 = true;
LAB_001cd8ac:
  if (pvVar200 != (void *)0x0) {
    ImGui::MemFree(pvVar200);
  }
  return bVar57;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}